

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  bool bVar46;
  undefined1 auVar47 [12];
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  uint uVar76;
  uint uVar77;
  uint uVar78;
  ulong uVar79;
  ulong uVar80;
  undefined4 uVar81;
  ulong uVar82;
  long lVar83;
  bool bVar84;
  float fVar85;
  vint4 bi_2;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar86;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 extraout_var [60];
  undefined1 auVar117 [64];
  float fVar118;
  undefined8 extraout_XMM1_Qa;
  float fVar154;
  vint4 bi_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar131 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar142 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar164 [32];
  float fVar171;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  vint4 ai_2;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar175 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar210;
  float fVar211;
  vint4 ai;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [28];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar205 [16];
  undefined1 auVar209 [32];
  vint4 bi;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar240;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar242 [16];
  undefined1 auVar241 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  float fVar258;
  vint4 ai_1;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar254 [32];
  undefined1 auVar253 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar259;
  float fVar260;
  undefined1 auVar257 [64];
  undefined1 auVar261 [16];
  undefined1 auVar263 [64];
  float fVar270;
  undefined1 auVar266 [32];
  float fVar268;
  float fVar269;
  undefined1 auVar264 [16];
  undefined1 auVar267 [64];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  undefined1 auVar277 [16];
  undefined1 auVar274 [64];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [64];
  float fVar281;
  float fVar285;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar284 [32];
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar290 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  float P_err;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined4 uStack_b10;
  undefined4 uStack_b0c;
  undefined4 uStack_b08;
  undefined4 uStack_b04;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  float local_ad8;
  float local_ad4;
  undefined1 local_ad0 [8];
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined8 *local_9d0;
  ulong local_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [48];
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined1 local_8a0 [16];
  Primitive *local_890;
  ulong local_888;
  undefined1 local_880 [32];
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 auStack_7b0 [8];
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  uint local_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  RTCHitN local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined4 local_6c0;
  undefined4 uStack_6bc;
  undefined4 uStack_6b8;
  undefined4 uStack_6b4;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined8 local_690;
  undefined8 uStack_688;
  undefined1 local_680 [16];
  uint local_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  uint uStack_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var_00 [60];
  undefined1 auVar152 [64];
  undefined1 auVar262 [16];
  undefined1 auVar265 [16];
  
  PVar2 = prim[1];
  uVar79 = (ulong)(byte)PVar2;
  fVar85 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar183 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar183 = vinsertps_avx(auVar183,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar94 = vsubps_avx(auVar94,*(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  auVar87._0_4_ = fVar85 * auVar94._0_4_;
  auVar87._4_4_ = fVar85 * auVar94._4_4_;
  auVar87._8_4_ = fVar85 * auVar94._8_4_;
  auVar87._12_4_ = fVar85 * auVar94._12_4_;
  auVar216._0_4_ = fVar85 * auVar183._0_4_;
  auVar216._4_4_ = fVar85 * auVar183._4_4_;
  auVar216._8_4_ = fVar85 * auVar183._8_4_;
  auVar216._12_4_ = fVar85 * auVar183._12_4_;
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 4 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 5 + 6)));
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 6 + 6)));
  auVar222 = vcvtdq2ps_avx(auVar222);
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xb + 6)));
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar277 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar79 + 6)));
  auVar277 = vcvtdq2ps_avx(auVar277);
  uVar82 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + uVar79 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  uVar82 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar282._4_4_ = auVar216._0_4_;
  auVar282._0_4_ = auVar216._0_4_;
  auVar282._8_4_ = auVar216._0_4_;
  auVar282._12_4_ = auVar216._0_4_;
  auVar120 = vshufps_avx(auVar216,auVar216,0x55);
  auVar88 = vshufps_avx(auVar216,auVar216,0xaa);
  fVar85 = auVar88._0_4_;
  auVar271._0_4_ = fVar85 * auVar222._0_4_;
  fVar118 = auVar88._4_4_;
  auVar271._4_4_ = fVar118 * auVar222._4_4_;
  fVar86 = auVar88._8_4_;
  auVar271._8_4_ = fVar86 * auVar222._8_4_;
  fVar153 = auVar88._12_4_;
  auVar271._12_4_ = fVar153 * auVar222._12_4_;
  auVar264._0_4_ = auVar277._0_4_ * fVar85;
  auVar264._4_4_ = auVar277._4_4_ * fVar118;
  auVar264._8_4_ = auVar277._8_4_ * fVar86;
  auVar264._12_4_ = auVar277._12_4_ * fVar153;
  auVar250._0_4_ = auVar138._0_4_ * fVar85;
  auVar250._4_4_ = auVar138._4_4_ * fVar118;
  auVar250._8_4_ = auVar138._8_4_ * fVar86;
  auVar250._12_4_ = auVar138._12_4_ * fVar153;
  auVar88 = vfmadd231ps_fma(auVar271,auVar120,auVar183);
  auVar121 = vfmadd231ps_fma(auVar264,auVar120,auVar96);
  auVar120 = vfmadd231ps_fma(auVar250,auVar89,auVar120);
  auVar175 = vfmadd231ps_fma(auVar88,auVar282,auVar94);
  auVar121 = vfmadd231ps_fma(auVar121,auVar282,auVar160);
  auVar201 = vfmadd231ps_fma(auVar120,auVar90,auVar282);
  auVar283._4_4_ = auVar87._0_4_;
  auVar283._0_4_ = auVar87._0_4_;
  auVar283._8_4_ = auVar87._0_4_;
  auVar283._12_4_ = auVar87._0_4_;
  auVar120 = vshufps_avx(auVar87,auVar87,0x55);
  auVar290 = ZEXT1664(auVar120);
  auVar88 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar85 = auVar88._0_4_;
  auVar217._0_4_ = fVar85 * auVar222._0_4_;
  fVar118 = auVar88._4_4_;
  auVar217._4_4_ = fVar118 * auVar222._4_4_;
  fVar86 = auVar88._8_4_;
  auVar217._8_4_ = fVar86 * auVar222._8_4_;
  fVar153 = auVar88._12_4_;
  auVar217._12_4_ = fVar153 * auVar222._12_4_;
  auVar119._0_4_ = auVar277._0_4_ * fVar85;
  auVar119._4_4_ = auVar277._4_4_ * fVar118;
  auVar119._8_4_ = auVar277._8_4_ * fVar86;
  auVar119._12_4_ = auVar277._12_4_ * fVar153;
  auVar88._0_4_ = auVar138._0_4_ * fVar85;
  auVar88._4_4_ = auVar138._4_4_ * fVar118;
  auVar88._8_4_ = auVar138._8_4_ * fVar86;
  auVar88._12_4_ = auVar138._12_4_ * fVar153;
  auVar183 = vfmadd231ps_fma(auVar217,auVar120,auVar183);
  auVar222 = vfmadd231ps_fma(auVar119,auVar120,auVar96);
  auVar96 = vfmadd231ps_fma(auVar88,auVar120,auVar89);
  auVar277 = vfmadd231ps_fma(auVar183,auVar283,auVar94);
  auVar89 = vfmadd231ps_fma(auVar222,auVar283,auVar160);
  auVar138 = vfmadd231ps_fma(auVar96,auVar283,auVar90);
  local_960._8_4_ = 0x7fffffff;
  local_960._0_8_ = 0x7fffffff7fffffff;
  local_960._12_4_ = 0x7fffffff;
  auVar94 = vandps_avx(auVar175,local_960);
  auVar200._8_4_ = 0x219392ef;
  auVar200._0_8_ = 0x219392ef219392ef;
  auVar200._12_4_ = 0x219392ef;
  auVar94 = vcmpps_avx(auVar94,auVar200,1);
  auVar183 = vblendvps_avx(auVar175,auVar200,auVar94);
  auVar94 = vandps_avx(auVar121,local_960);
  auVar94 = vcmpps_avx(auVar94,auVar200,1);
  auVar222 = vblendvps_avx(auVar121,auVar200,auVar94);
  auVar94 = vandps_avx(auVar201,local_960);
  auVar94 = vcmpps_avx(auVar94,auVar200,1);
  auVar94 = vblendvps_avx(auVar201,auVar200,auVar94);
  auVar160 = vrcpps_avx(auVar183);
  auVar241._8_4_ = 0x3f800000;
  auVar241._0_8_ = &DAT_3f8000003f800000;
  auVar241._12_4_ = 0x3f800000;
  auVar183 = vfnmadd213ps_fma(auVar183,auVar160,auVar241);
  auVar160 = vfmadd132ps_fma(auVar183,auVar160,auVar160);
  auVar183 = vrcpps_avx(auVar222);
  auVar222 = vfnmadd213ps_fma(auVar222,auVar183,auVar241);
  auVar96 = vfmadd132ps_fma(auVar222,auVar183,auVar183);
  auVar183 = vrcpps_avx(auVar94);
  auVar94 = vfnmadd213ps_fma(auVar94,auVar183,auVar241);
  auVar90 = vfmadd132ps_fma(auVar94,auVar183,auVar183);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar79 * 7 + 6);
  auVar94 = vpmovsxwd_avx(auVar94);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar277);
  auVar201._0_4_ = auVar160._0_4_ * auVar94._0_4_;
  auVar201._4_4_ = auVar160._4_4_ * auVar94._4_4_;
  auVar201._8_4_ = auVar160._8_4_ * auVar94._8_4_;
  auVar201._12_4_ = auVar160._12_4_ * auVar94._12_4_;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar79 * 9 + 6);
  auVar94 = vpmovsxwd_avx(auVar183);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar277);
  auVar218._0_4_ = auVar160._0_4_ * auVar94._0_4_;
  auVar218._4_4_ = auVar160._4_4_ * auVar94._4_4_;
  auVar218._8_4_ = auVar160._8_4_ * auVar94._8_4_;
  auVar218._12_4_ = auVar160._12_4_ * auVar94._12_4_;
  auVar121._1_3_ = 0;
  auVar121[0] = PVar2;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar183 = vpmovsxwd_avx(auVar222);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar79 * -2 + 6);
  auVar94 = vpmovsxwd_avx(auVar160);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar89);
  auVar251._0_4_ = auVar94._0_4_ * auVar96._0_4_;
  auVar251._4_4_ = auVar94._4_4_ * auVar96._4_4_;
  auVar251._8_4_ = auVar94._8_4_ * auVar96._8_4_;
  auVar251._12_4_ = auVar94._12_4_ * auVar96._12_4_;
  auVar94 = vcvtdq2ps_avx(auVar183);
  auVar94 = vsubps_avx(auVar94,auVar89);
  auVar120._0_4_ = auVar96._0_4_ * auVar94._0_4_;
  auVar120._4_4_ = auVar96._4_4_ * auVar94._4_4_;
  auVar120._8_4_ = auVar96._8_4_ * auVar94._8_4_;
  auVar120._12_4_ = auVar96._12_4_ * auVar94._12_4_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar82 + uVar79 + 6);
  auVar94 = vpmovsxwd_avx(auVar96);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar138);
  auVar175._0_4_ = auVar90._0_4_ * auVar94._0_4_;
  auVar175._4_4_ = auVar90._4_4_ * auVar94._4_4_;
  auVar175._8_4_ = auVar90._8_4_ * auVar94._8_4_;
  auVar175._12_4_ = auVar90._12_4_ * auVar94._12_4_;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = *(ulong *)(prim + uVar79 * 0x17 + 6);
  auVar94 = vpmovsxwd_avx(auVar277);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar138);
  auVar89._0_4_ = auVar90._0_4_ * auVar94._0_4_;
  auVar89._4_4_ = auVar90._4_4_ * auVar94._4_4_;
  auVar89._8_4_ = auVar90._8_4_ * auVar94._8_4_;
  auVar89._12_4_ = auVar90._12_4_ * auVar94._12_4_;
  auVar94 = vpminsd_avx(auVar201,auVar218);
  auVar183 = vpminsd_avx(auVar251,auVar120);
  auVar94 = vmaxps_avx(auVar94,auVar183);
  auVar183 = vpminsd_avx(auVar175,auVar89);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar261._4_4_ = uVar81;
  auVar261._0_4_ = uVar81;
  auVar261._8_4_ = uVar81;
  auVar261._12_4_ = uVar81;
  auVar183 = vmaxps_avx(auVar183,auVar261);
  auVar94 = vmaxps_avx(auVar94,auVar183);
  local_4b0._0_4_ = auVar94._0_4_ * 0.99999964;
  local_4b0._4_4_ = auVar94._4_4_ * 0.99999964;
  local_4b0._8_4_ = auVar94._8_4_ * 0.99999964;
  local_4b0._12_4_ = auVar94._12_4_ * 0.99999964;
  auVar94 = vpmaxsd_avx(auVar201,auVar218);
  auVar183 = vpmaxsd_avx(auVar251,auVar120);
  auVar94 = vminps_avx(auVar94,auVar183);
  auVar183 = vpmaxsd_avx(auVar175,auVar89);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar138._4_4_ = uVar81;
  auVar138._0_4_ = uVar81;
  auVar138._8_4_ = uVar81;
  auVar138._12_4_ = uVar81;
  auVar183 = vminps_avx(auVar183,auVar138);
  auVar94 = vminps_avx(auVar94,auVar183);
  auVar90._0_4_ = auVar94._0_4_ * 1.0000004;
  auVar90._4_4_ = auVar94._4_4_ * 1.0000004;
  auVar90._8_4_ = auVar94._8_4_ * 1.0000004;
  auVar90._12_4_ = auVar94._12_4_ * 1.0000004;
  auVar121[4] = PVar2;
  auVar121._5_3_ = 0;
  auVar121[8] = PVar2;
  auVar121._9_3_ = 0;
  auVar121[0xc] = PVar2;
  auVar121._13_3_ = 0;
  auVar183 = vpcmpgtd_avx(auVar121,_DAT_01ff0cf0);
  auVar94 = vcmpps_avx(local_4b0,auVar90,2);
  auVar94 = vandps_avx(auVar94,auVar183);
  uVar76 = vmovmskps_avx(auVar94);
  if (uVar76 == 0) {
    return;
  }
  auVar100._16_16_ = mm_lookupmask_ps._240_16_;
  auVar100._0_16_ = mm_lookupmask_ps._240_16_;
  uVar76 = uVar76 & 0xff;
  local_380 = vblendps_avx(auVar100,ZEXT832(0) << 0x20,0x80);
  local_9d0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_860 = 0x7fffffff;
  uStack_85c = 0x7fffffff;
  uStack_858 = 0x7fffffff;
  uStack_854 = 0x7fffffff;
  uStack_850 = 0x7fffffff;
  uStack_84c = 0x7fffffff;
  uStack_848 = 0x7fffffff;
  uStack_844 = 0x7fffffff;
  local_890 = prim;
LAB_0168d19f:
  lVar83 = 0;
  local_888 = (ulong)uVar76;
  for (uVar82 = local_888; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    lVar83 = lVar83 + 1;
  }
  uVar76 = *(uint *)(local_890 + 2);
  local_700 = *(uint *)(local_890 + lVar83 * 4 + 6);
  local_9c8 = (ulong)local_700;
  pGVar4 = (context->scene->geometries).items[uVar76].ptr;
  lVar83 = *(long *)&pGVar4[1].time_range.upper;
  uVar82 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           local_9c8 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar94 = *(undefined1 (*) [16])(lVar83 + (long)pGVar4[1].intersectionFilterN * uVar82);
  auVar183 = *(undefined1 (*) [16])(lVar83 + (long)pGVar4[1].intersectionFilterN * (uVar82 + 1));
  auVar222 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar160 = vinsertps_avx(auVar222,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar252._4_4_ = uVar81;
  auVar252._0_4_ = uVar81;
  auVar252._8_4_ = uVar81;
  auVar252._12_4_ = uVar81;
  fStack_7d0 = (float)uVar81;
  _local_7e0 = auVar252;
  fStack_7cc = (float)uVar81;
  fStack_7c8 = (float)uVar81;
  register0x0000141c = uVar81;
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar262._4_4_ = uVar81;
  auVar262._0_4_ = uVar81;
  auVar262._8_4_ = uVar81;
  auVar262._12_4_ = uVar81;
  fStack_7f0 = (float)uVar81;
  _local_800 = auVar262;
  fStack_7ec = (float)uVar81;
  fStack_7e8 = (float)uVar81;
  register0x0000145c = uVar81;
  auVar263 = ZEXT3264(_local_800);
  auVar222 = vunpcklps_avx(auVar252,auVar262);
  fVar85 = *(float *)(ray + k * 4 + 0x60);
  auVar265._4_4_ = fVar85;
  auVar265._0_4_ = fVar85;
  auVar265._8_4_ = fVar85;
  auVar265._12_4_ = fVar85;
  fStack_830 = fVar85;
  _local_840 = auVar265;
  fStack_82c = fVar85;
  fStack_828 = fVar85;
  uStack_824 = fVar85;
  auVar267 = ZEXT3264(_local_840);
  local_950 = vinsertps_avx(auVar222,auVar265,0x28);
  auVar273 = ZEXT1664(local_950);
  auVar219._8_4_ = 0xbeaaaaab;
  auVar219._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar219._12_4_ = 0xbeaaaaab;
  auVar90 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar4[2].intersectionFilterN +
                              uVar82 * (long)pGVar4[2].pointQueryFunc),auVar94,auVar219);
  auVar277 = vfmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar4[2].intersectionFilterN +
                              (long)pGVar4[2].pointQueryFunc * (uVar82 + 1)),auVar183,auVar219);
  auVar220._0_4_ = (auVar183._0_4_ + auVar94._0_4_ + auVar90._0_4_ + auVar277._0_4_) * 0.25;
  auVar220._4_4_ = (auVar183._4_4_ + auVar94._4_4_ + auVar90._4_4_ + auVar277._4_4_) * 0.25;
  auVar220._8_4_ = (auVar183._8_4_ + auVar94._8_4_ + auVar90._8_4_ + auVar277._8_4_) * 0.25;
  auVar220._12_4_ = (auVar183._12_4_ + auVar94._12_4_ + auVar90._12_4_ + auVar277._12_4_) * 0.25;
  auVar222 = vsubps_avx(auVar220,auVar160);
  auVar222 = vdpps_avx(auVar222,local_950,0x7f);
  local_970 = vdpps_avx(local_950,local_950,0x7f);
  auVar96 = vrcpss_avx(local_970,local_970);
  auVar89 = vfnmadd213ss_fma(auVar96,local_970,ZEXT416(0x40000000));
  local_3a0 = auVar222._0_4_ * auVar96._0_4_ * auVar89._0_4_;
  auVar233 = ZEXT464((uint)local_3a0);
  auVar234._4_4_ = local_3a0;
  auVar234._0_4_ = local_3a0;
  auVar234._8_4_ = local_3a0;
  auVar234._12_4_ = local_3a0;
  fStack_790 = local_3a0;
  _local_7a0 = auVar234;
  fStack_78c = local_3a0;
  fStack_788 = local_3a0;
  fStack_784 = local_3a0;
  auVar222 = vfmadd231ps_fma(auVar160,local_950,auVar234);
  auVar222 = vblendps_avx(auVar222,_DAT_01feba10,8);
  local_aa0 = vsubps_avx(auVar94,auVar222);
  local_ab0 = vsubps_avx(auVar277,auVar222);
  auVar249 = ZEXT1664(local_ab0);
  local_ac0 = vsubps_avx(auVar90,auVar222);
  _local_ad0 = vsubps_avx(auVar183,auVar222);
  auVar94 = vmovshdup_avx(local_aa0);
  local_1a0 = auVar94._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar94 = vshufps_avx(local_aa0,local_aa0,0xaa);
  local_1c0 = auVar94._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar94 = vshufps_avx(local_aa0,local_aa0,0xff);
  local_1e0 = auVar94._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar94 = vmovshdup_avx(local_ac0);
  local_200 = auVar94._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar94 = vshufps_avx(local_ac0,local_ac0,0xaa);
  local_220 = auVar94._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar94 = vshufps_avx(local_ac0,local_ac0,0xff);
  local_240 = auVar94._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar94 = vmovshdup_avx(local_ab0);
  local_460 = auVar94._0_4_;
  fStack_45c = auVar94._4_4_;
  auVar94 = vshufps_avx(local_ab0,local_ab0,0xaa);
  local_480 = auVar94._0_4_;
  fStack_47c = auVar94._4_4_;
  auVar94 = vshufps_avx(local_ab0,local_ab0,0xff);
  local_260 = auVar94._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar94 = vmovshdup_avx(_local_ad0);
  local_280 = auVar94._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar94 = vshufps_avx(_local_ad0,_local_ad0,0xaa);
  local_2a0 = auVar94._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar94 = vshufps_avx(_local_ad0,_local_ad0,0xff);
  local_2c0 = auVar94._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar94 = vfmadd231ps_fma(ZEXT432((uint)(fVar85 * fVar85)),_local_800,_local_800);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),_local_7e0,_local_7e0);
  uVar81 = auVar94._0_4_;
  local_2e0._4_4_ = uVar81;
  local_2e0._0_4_ = uVar81;
  local_2e0._8_4_ = uVar81;
  local_2e0._12_4_ = uVar81;
  local_2e0._16_4_ = uVar81;
  local_2e0._20_4_ = uVar81;
  local_2e0._24_4_ = uVar81;
  local_2e0._28_4_ = uVar81;
  auVar257 = ZEXT3264(local_2e0);
  fVar85 = *(float *)(ray + k * 4 + 0x30);
  local_8a0 = ZEXT416((uint)local_3a0);
  local_3a0 = fVar85 - local_3a0;
  fStack_39c = local_3a0;
  fStack_398 = local_3a0;
  fStack_394 = local_3a0;
  fStack_390 = local_3a0;
  fStack_38c = local_3a0;
  fStack_388 = local_3a0;
  fStack_384 = local_3a0;
  uVar79 = 0;
  uVar82 = 1;
  local_300 = local_aa0._0_4_;
  uStack_2fc = local_300;
  uStack_2f8 = local_300;
  uStack_2f4 = local_300;
  uStack_2f0 = local_300;
  uStack_2ec = local_300;
  uStack_2e8 = local_300;
  uStack_2e4 = local_300;
  local_320 = local_ac0._0_4_;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_340 = local_ab0._0_4_;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  local_360 = local_ad0._0_4_;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  auVar114._4_4_ = uStack_85c;
  auVar114._0_4_ = local_860;
  auVar114._8_4_ = uStack_858;
  auVar114._12_4_ = uStack_854;
  auVar114._16_4_ = uStack_850;
  auVar114._20_4_ = uStack_84c;
  auVar114._24_4_ = uStack_848;
  auVar114._28_4_ = uStack_844;
  local_4a0 = vandps_avx(local_2e0,auVar114);
  auVar94 = vsqrtss_avx(local_970,local_970);
  local_ad4 = auVar94._0_4_;
  auVar94 = vsqrtss_avx(local_970,local_970);
  local_ad8 = auVar94._0_4_;
  local_8b0 = 0x3f80000000000000;
  uStack_8a8 = 0;
  uStack_6fc = local_700;
  uStack_6f8 = local_700;
  uStack_6f4 = local_700;
  local_6f0 = uVar76;
  uStack_6ec = uVar76;
  uStack_6e8 = uVar76;
  uStack_6e4 = uVar76;
  fStack_478 = local_480;
  fStack_474 = fStack_47c;
  fStack_470 = local_480;
  fStack_46c = fStack_47c;
  fStack_468 = local_480;
  fStack_464 = fStack_47c;
  fStack_458 = local_460;
  fStack_454 = fStack_45c;
  fStack_450 = local_460;
  fStack_44c = fStack_45c;
  fStack_448 = local_460;
  fStack_444 = fStack_45c;
  do {
    auVar164._8_4_ = 0x3f800000;
    auVar164._0_8_ = &DAT_3f8000003f800000;
    auVar164._12_4_ = 0x3f800000;
    auVar164._16_4_ = 0x3f800000;
    auVar164._20_4_ = 0x3f800000;
    auVar164._24_4_ = 0x3f800000;
    auVar164._28_4_ = 0x3f800000;
    auVar58._8_8_ = uStack_8a8;
    auVar58._0_8_ = local_8b0;
    auVar94 = vmovshdup_avx(auVar58);
    fVar86 = (float)local_8b0;
    fVar118 = auVar94._0_4_ - fVar86;
    fVar158 = fVar118 * 0.04761905;
    local_940._4_4_ = fVar86;
    local_940._0_4_ = fVar86;
    local_940._8_4_ = fVar86;
    local_940._12_4_ = fVar86;
    local_940._16_4_ = fVar86;
    local_940._20_4_ = fVar86;
    local_940._24_4_ = fVar86;
    local_940._28_4_ = fVar86;
    local_920._4_4_ = fVar118;
    local_920._0_4_ = fVar118;
    local_920._8_4_ = fVar118;
    local_920._12_4_ = fVar118;
    local_920._16_4_ = fVar118;
    local_920._20_4_ = fVar118;
    local_920._24_4_ = fVar118;
    local_920._28_4_ = fVar118;
    auVar94 = vfmadd231ps_fma(local_940,local_920,_DAT_02020f20);
    auVar100 = vsubps_avx(auVar164,ZEXT1632(auVar94));
    auVar67._4_4_ = fStack_31c;
    auVar67._0_4_ = local_320;
    auVar67._8_4_ = fStack_318;
    auVar67._12_4_ = fStack_314;
    auVar67._16_4_ = fStack_310;
    auVar67._20_4_ = fStack_30c;
    auVar67._24_4_ = fStack_308;
    auVar67._28_4_ = fStack_304;
    fVar118 = auVar94._0_4_;
    auVar274._0_4_ = local_320 * fVar118;
    fVar86 = auVar94._4_4_;
    auVar274._4_4_ = fStack_31c * fVar86;
    fVar153 = auVar94._8_4_;
    auVar274._8_4_ = fStack_318 * fVar153;
    fVar258 = auVar94._12_4_;
    auVar274._12_4_ = fStack_314 * fVar258;
    auVar274._16_4_ = fStack_310 * 0.0;
    auVar274._20_4_ = fStack_30c * 0.0;
    auVar274._28_36_ = auVar273._28_36_;
    auVar274._24_4_ = fStack_308 * 0.0;
    auVar72._8_8_ = uStack_1f8;
    auVar72._0_8_ = local_200;
    auVar72._16_8_ = uStack_1f0;
    auVar72._24_8_ = uStack_1e8;
    auVar280._0_4_ = (float)local_200 * fVar118;
    auVar280._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar86;
    auVar280._8_4_ = (float)uStack_1f8 * fVar153;
    auVar280._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar258;
    auVar280._16_4_ = (float)uStack_1f0 * 0.0;
    auVar280._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar280._28_36_ = auVar267._28_36_;
    auVar280._24_4_ = (float)uStack_1e8 * 0.0;
    auVar71._8_8_ = uStack_218;
    auVar71._0_8_ = local_220;
    auVar71._16_8_ = uStack_210;
    auVar71._24_8_ = uStack_208;
    auVar273._0_4_ = (float)local_220 * fVar118;
    auVar273._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar86;
    auVar273._8_4_ = (float)uStack_218 * fVar153;
    auVar273._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar258;
    auVar273._16_4_ = (float)uStack_210 * 0.0;
    auVar273._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar273._28_36_ = auVar263._28_36_;
    auVar273._24_4_ = (float)uStack_208 * 0.0;
    auVar70._8_8_ = uStack_238;
    auVar70._0_8_ = local_240;
    auVar70._16_8_ = uStack_230;
    auVar70._24_8_ = uStack_228;
    auVar263._0_4_ = (float)local_240 * fVar118;
    auVar263._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar86;
    auVar263._8_4_ = (float)uStack_238 * fVar153;
    auVar263._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar258;
    auVar263._16_4_ = (float)uStack_230 * 0.0;
    auVar263._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar263._28_36_ = auVar249._28_36_;
    auVar263._24_4_ = (float)uStack_228 * 0.0;
    auVar68._4_4_ = uStack_2fc;
    auVar68._0_4_ = local_300;
    auVar68._8_4_ = uStack_2f8;
    auVar68._12_4_ = uStack_2f4;
    auVar68._16_4_ = uStack_2f0;
    auVar68._20_4_ = uStack_2ec;
    auVar68._24_4_ = uStack_2e8;
    auVar68._28_4_ = uStack_2e4;
    auVar94 = vfmadd231ps_fma(auVar274._0_32_,auVar100,auVar68);
    auVar75._8_8_ = uStack_198;
    auVar75._0_8_ = local_1a0;
    auVar75._16_8_ = uStack_190;
    auVar75._24_8_ = uStack_188;
    auVar183 = vfmadd231ps_fma(auVar280._0_32_,auVar100,auVar75);
    auVar74._8_8_ = uStack_1b8;
    auVar74._0_8_ = local_1c0;
    auVar74._16_8_ = uStack_1b0;
    auVar74._24_8_ = uStack_1a8;
    auVar222 = vfmadd231ps_fma(auVar273._0_32_,auVar100,auVar74);
    auVar73._8_8_ = uStack_1d8;
    auVar73._0_8_ = local_1e0;
    auVar73._16_8_ = uStack_1d0;
    auVar73._24_8_ = uStack_1c8;
    auVar160 = vfmadd231ps_fma(auVar263._0_32_,auVar100,auVar73);
    auVar66._4_4_ = fStack_33c;
    auVar66._0_4_ = local_340;
    auVar66._8_4_ = fStack_338;
    auVar66._12_4_ = fStack_334;
    auVar66._16_4_ = fStack_330;
    auVar66._20_4_ = fStack_32c;
    auVar66._24_4_ = fStack_328;
    auVar66._28_4_ = fStack_324;
    auVar267._0_4_ = local_340 * fVar118;
    auVar267._4_4_ = fStack_33c * fVar86;
    auVar267._8_4_ = fStack_338 * fVar153;
    auVar267._12_4_ = fStack_334 * fVar258;
    auVar267._16_4_ = fStack_330 * 0.0;
    auVar267._20_4_ = fStack_32c * 0.0;
    auVar267._28_36_ = auVar257._28_36_;
    auVar267._24_4_ = fStack_328 * 0.0;
    auVar249._0_4_ = fVar118 * local_460;
    auVar249._4_4_ = fVar86 * fStack_45c;
    auVar249._8_4_ = fVar153 * fStack_458;
    auVar249._12_4_ = fVar258 * fStack_454;
    auVar249._16_4_ = fStack_450 * 0.0;
    auVar249._20_4_ = fStack_44c * 0.0;
    auVar249._28_36_ = auVar233._28_36_;
    auVar249._24_4_ = fStack_448 * 0.0;
    auVar103._4_4_ = fVar86 * fStack_47c;
    auVar103._0_4_ = fVar118 * local_480;
    auVar103._8_4_ = fVar153 * fStack_478;
    auVar103._12_4_ = fVar258 * fStack_474;
    auVar103._16_4_ = fStack_470 * 0.0;
    auVar103._20_4_ = fStack_46c * 0.0;
    auVar103._24_4_ = fStack_468 * 0.0;
    auVar103._28_4_ = 0x3f800000;
    auVar69._8_8_ = uStack_258;
    auVar69._0_8_ = local_260;
    auVar69._16_8_ = uStack_250;
    auVar69._24_8_ = uStack_248;
    auVar233._0_4_ = (float)local_260 * fVar118;
    auVar233._4_4_ = (float)((ulong)local_260 >> 0x20) * fVar86;
    auVar233._8_4_ = (float)uStack_258 * fVar153;
    auVar233._12_4_ = (float)((ulong)uStack_258 >> 0x20) * fVar258;
    auVar233._16_4_ = (float)uStack_250 * 0.0;
    auVar233._20_4_ = (float)((ulong)uStack_250 >> 0x20) * 0.0;
    auVar233._28_36_ = auVar290._28_36_;
    auVar233._24_4_ = (float)uStack_248 * 0.0;
    auVar96 = vfmadd231ps_fma(auVar267._0_32_,auVar100,auVar67);
    auVar277 = vfmadd231ps_fma(auVar249._0_32_,auVar100,auVar72);
    auVar90 = vfmadd231ps_fma(auVar103,auVar100,auVar71);
    auVar89 = vfmadd231ps_fma(auVar233._0_32_,auVar100,auVar70);
    auVar9._4_4_ = fVar86 * fStack_35c;
    auVar9._0_4_ = fVar118 * local_360;
    auVar9._8_4_ = fVar153 * fStack_358;
    auVar9._12_4_ = fVar258 * fStack_354;
    auVar9._16_4_ = fStack_350 * 0.0;
    auVar9._20_4_ = fStack_34c * 0.0;
    auVar9._24_4_ = fStack_348 * 0.0;
    auVar9._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar10._4_4_ = fVar86 * local_280._4_4_;
    auVar10._0_4_ = fVar118 * (float)local_280;
    auVar10._8_4_ = fVar153 * (float)uStack_278;
    auVar10._12_4_ = fVar258 * uStack_278._4_4_;
    auVar10._16_4_ = (float)uStack_270 * 0.0;
    auVar10._20_4_ = uStack_270._4_4_ * 0.0;
    auVar10._24_4_ = (float)uStack_268 * 0.0;
    auVar10._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar166._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar166._0_28_ =
         ZEXT1628(CONCAT412(auVar96._12_4_ * fVar258,
                            CONCAT48(auVar96._8_4_ * fVar153,
                                     CONCAT44(auVar96._4_4_ * fVar86,auVar96._0_4_ * fVar118))));
    auVar94 = vfmadd231ps_fma(auVar166,auVar100,ZEXT1632(auVar94));
    auVar183 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar258 * auVar277._12_4_,
                                                  CONCAT48(fVar153 * auVar277._8_4_,
                                                           CONCAT44(fVar86 * auVar277._4_4_,
                                                                    fVar118 * auVar277._0_4_)))),
                               auVar100,ZEXT1632(auVar183));
    auVar222 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar258 * auVar90._12_4_,
                                                  CONCAT48(fVar153 * auVar90._8_4_,
                                                           CONCAT44(fVar86 * auVar90._4_4_,
                                                                    fVar118 * auVar90._0_4_)))),
                               auVar100,ZEXT1632(auVar222));
    auVar160 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar89._12_4_ * fVar258,
                                                  CONCAT48(auVar89._8_4_ * fVar153,
                                                           CONCAT44(auVar89._4_4_ * fVar86,
                                                                    auVar89._0_4_ * fVar118)))),
                               auVar100,ZEXT1632(auVar160));
    auVar243._0_4_ = fVar118 * (float)local_2a0;
    auVar243._4_4_ = fVar86 * local_2a0._4_4_;
    auVar243._8_4_ = fVar153 * (float)uStack_298;
    auVar243._12_4_ = fVar258 * uStack_298._4_4_;
    auVar243._16_4_ = (float)uStack_290 * 0.0;
    auVar243._20_4_ = uStack_290._4_4_ * 0.0;
    auVar243._24_4_ = (float)uStack_288 * 0.0;
    auVar243._28_4_ = 0;
    auVar138 = vfmadd231ps_fma(auVar9,auVar100,auVar66);
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar138._12_4_ * fVar258,
                                                 CONCAT48(auVar138._8_4_ * fVar153,
                                                          CONCAT44(auVar138._4_4_ * fVar86,
                                                                   auVar138._0_4_ * fVar118)))),
                              auVar100,ZEXT1632(auVar96));
    auVar254._0_4_ = fVar118 * (float)local_2c0;
    auVar254._4_4_ = fVar86 * local_2c0._4_4_;
    auVar254._8_4_ = fVar153 * (float)uStack_2b8;
    auVar254._12_4_ = fVar258 * uStack_2b8._4_4_;
    auVar254._16_4_ = (float)uStack_2b0 * 0.0;
    auVar254._20_4_ = uStack_2b0._4_4_ * 0.0;
    auVar254._24_4_ = (float)uStack_2a8 * 0.0;
    auVar254._28_4_ = 0;
    auVar191._4_4_ = fStack_45c;
    auVar191._0_4_ = local_460;
    auVar191._8_4_ = fStack_458;
    auVar191._12_4_ = fStack_454;
    auVar191._16_4_ = fStack_450;
    auVar191._20_4_ = fStack_44c;
    auVar191._24_4_ = fStack_448;
    auVar191._28_4_ = fStack_444;
    auVar138 = vfmadd231ps_fma(auVar10,auVar100,auVar191);
    auVar101._4_4_ = fStack_47c;
    auVar101._0_4_ = local_480;
    auVar101._8_4_ = fStack_478;
    auVar101._12_4_ = fStack_474;
    auVar101._16_4_ = fStack_470;
    auVar101._20_4_ = fStack_46c;
    auVar101._24_4_ = fStack_468;
    auVar101._28_4_ = fStack_464;
    auVar120 = vfmadd231ps_fma(auVar243,auVar100,auVar101);
    auVar88 = vfmadd231ps_fma(auVar254,auVar100,auVar69);
    auVar228._28_4_ = fStack_324;
    auVar228._0_28_ =
         ZEXT1628(CONCAT412(auVar88._12_4_ * fVar258,
                            CONCAT48(auVar88._8_4_ * fVar153,
                                     CONCAT44(auVar88._4_4_ * fVar86,auVar88._0_4_ * fVar118))));
    auVar277 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar138._12_4_ * fVar258,
                                                  CONCAT48(auVar138._8_4_ * fVar153,
                                                           CONCAT44(auVar138._4_4_ * fVar86,
                                                                    auVar138._0_4_ * fVar118)))),
                               auVar100,ZEXT1632(auVar277));
    auVar90 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar258 * auVar120._12_4_,
                                                 CONCAT48(fVar153 * auVar120._8_4_,
                                                          CONCAT44(fVar86 * auVar120._4_4_,
                                                                   fVar118 * auVar120._0_4_)))),
                              auVar100,ZEXT1632(auVar90));
    auVar89 = vfmadd231ps_fma(auVar228,auVar100,ZEXT1632(auVar89));
    auVar195._28_4_ = (int)((ulong)uStack_248 >> 0x20);
    auVar195._0_28_ =
         ZEXT1628(CONCAT412(auVar277._12_4_ * fVar258,
                            CONCAT48(auVar277._8_4_ * fVar153,
                                     CONCAT44(auVar277._4_4_ * fVar86,auVar277._0_4_ * fVar118))));
    auVar138 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar96._12_4_ * fVar258,
                                                  CONCAT48(auVar96._8_4_ * fVar153,
                                                           CONCAT44(auVar96._4_4_ * fVar86,
                                                                    auVar96._0_4_ * fVar118)))),
                               auVar100,ZEXT1632(auVar94));
    auVar120 = vfmadd231ps_fma(auVar195,auVar100,ZEXT1632(auVar183));
    auVar101 = ZEXT1632(auVar120);
    auVar120 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar258 * auVar90._12_4_,
                                                  CONCAT48(fVar153 * auVar90._8_4_,
                                                           CONCAT44(fVar86 * auVar90._4_4_,
                                                                    fVar118 * auVar90._0_4_)))),
                               auVar100,ZEXT1632(auVar222));
    auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar89._12_4_ * fVar258,
                                                 CONCAT48(auVar89._8_4_ * fVar153,
                                                          CONCAT44(auVar89._4_4_ * fVar86,
                                                                   auVar89._0_4_ * fVar118)))),
                              ZEXT1632(auVar160),auVar100);
    auVar257 = ZEXT1664(auVar88);
    auVar114 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar94));
    auVar100 = vsubps_avx(ZEXT1632(auVar277),ZEXT1632(auVar183));
    auVar103 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar222));
    auVar9 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar160));
    local_a20._0_4_ = fVar158 * auVar114._0_4_ * 3.0;
    local_a20._4_4_ = fVar158 * auVar114._4_4_ * 3.0;
    local_a20._8_4_ = fVar158 * auVar114._8_4_ * 3.0;
    local_a20._12_4_ = fVar158 * auVar114._12_4_ * 3.0;
    local_a20._16_4_ = fVar158 * auVar114._16_4_ * 3.0;
    local_a20._20_4_ = fVar158 * auVar114._20_4_ * 3.0;
    local_a20._24_4_ = fVar158 * auVar114._24_4_ * 3.0;
    local_a20._28_4_ = 0;
    local_9a0._0_4_ = fVar158 * auVar100._0_4_ * 3.0;
    local_9a0._4_4_ = fVar158 * auVar100._4_4_ * 3.0;
    local_9a0._8_4_ = fVar158 * auVar100._8_4_ * 3.0;
    local_9a0._12_4_ = fVar158 * auVar100._12_4_ * 3.0;
    local_9a0._16_4_ = fVar158 * auVar100._16_4_ * 3.0;
    local_9a0._20_4_ = fVar158 * auVar100._20_4_ * 3.0;
    local_9a0._24_4_ = fVar158 * auVar100._24_4_ * 3.0;
    local_9a0._28_4_ = 0;
    local_a40._0_4_ = fVar158 * auVar103._0_4_ * 3.0;
    local_a40._4_4_ = fVar158 * auVar103._4_4_ * 3.0;
    local_a40._8_4_ = fVar158 * auVar103._8_4_ * 3.0;
    local_a40._12_4_ = fVar158 * auVar103._12_4_ * 3.0;
    local_a40._16_4_ = fVar158 * auVar103._16_4_ * 3.0;
    local_a40._20_4_ = fVar158 * auVar103._20_4_ * 3.0;
    local_a40._24_4_ = fVar158 * auVar103._24_4_ * 3.0;
    local_a40._28_4_ = 0;
    fVar118 = fVar158 * auVar9._0_4_ * 3.0;
    fVar153 = fVar158 * auVar9._4_4_ * 3.0;
    auVar11._4_4_ = fVar153;
    auVar11._0_4_ = fVar118;
    fVar154 = fVar158 * auVar9._8_4_ * 3.0;
    auVar11._8_4_ = fVar154;
    fVar155 = fVar158 * auVar9._12_4_ * 3.0;
    auVar11._12_4_ = fVar155;
    fVar156 = fVar158 * auVar9._16_4_ * 3.0;
    auVar11._16_4_ = fVar156;
    fVar157 = fVar158 * auVar9._20_4_ * 3.0;
    auVar11._20_4_ = fVar157;
    fVar158 = fVar158 * auVar9._24_4_ * 3.0;
    auVar11._24_4_ = fVar158;
    auVar11._28_4_ = auVar114._28_4_;
    auVar191 = ZEXT1632(auVar138);
    local_8e0._0_32_ = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar138));
    local_a00 = vpermps_avx2(_DAT_0205d4a0,auVar101);
    local_720 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar120));
    local_540 = vsubps_avx(local_8e0._0_32_,auVar191);
    local_520 = vsubps_avx(local_720,ZEXT1632(auVar120));
    fVar171 = local_520._0_4_;
    fVar172 = local_520._4_4_;
    auVar194._4_4_ = fVar172 * local_a20._4_4_;
    auVar194._0_4_ = fVar171 * (float)local_a20._0_4_;
    fVar173 = local_520._8_4_;
    auVar194._8_4_ = fVar173 * local_a20._8_4_;
    fVar174 = local_520._12_4_;
    auVar194._12_4_ = fVar174 * local_a20._12_4_;
    fVar214 = local_520._16_4_;
    auVar194._16_4_ = fVar214 * local_a20._16_4_;
    fVar215 = local_520._20_4_;
    auVar194._20_4_ = fVar215 * local_a20._20_4_;
    fVar240 = local_520._24_4_;
    auVar194._24_4_ = fVar240 * local_a20._24_4_;
    auVar194._28_4_ = local_720._28_4_;
    auVar94 = vfmsub231ps_fma(auVar194,local_a40,local_540);
    local_560 = vsubps_avx(local_a00,auVar101);
    fVar270 = local_540._0_4_;
    fVar281 = local_540._4_4_;
    auVar104._4_4_ = fVar281 * local_9a0._4_4_;
    auVar104._0_4_ = fVar270 * (float)local_9a0._0_4_;
    fVar285 = local_540._8_4_;
    auVar104._8_4_ = fVar285 * local_9a0._8_4_;
    fVar286 = local_540._12_4_;
    auVar104._12_4_ = fVar286 * local_9a0._12_4_;
    fVar287 = local_540._16_4_;
    auVar104._16_4_ = fVar287 * local_9a0._16_4_;
    fVar288 = local_540._20_4_;
    auVar104._20_4_ = fVar288 * local_9a0._20_4_;
    fVar289 = local_540._24_4_;
    auVar104._24_4_ = fVar289 * local_9a0._24_4_;
    auVar104._28_4_ = local_8e0._28_4_;
    auVar183 = vfmsub231ps_fma(auVar104,local_a20,local_560);
    auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar183._12_4_ * auVar183._12_4_,
                                                 CONCAT48(auVar183._8_4_ * auVar183._8_4_,
                                                          CONCAT44(auVar183._4_4_ * auVar183._4_4_,
                                                                   auVar183._0_4_ * auVar183._0_4_))
                                                )),ZEXT1632(auVar94),ZEXT1632(auVar94));
    fVar199 = local_560._0_4_;
    fVar210 = local_560._4_4_;
    auVar266._4_4_ = fVar210 * local_a40._4_4_;
    auVar266._0_4_ = fVar199 * (float)local_a40._0_4_;
    fVar211 = local_560._8_4_;
    auVar266._8_4_ = fVar211 * local_a40._8_4_;
    fVar212 = local_560._12_4_;
    auVar266._12_4_ = fVar212 * local_a40._12_4_;
    fVar213 = local_560._16_4_;
    auVar266._16_4_ = fVar213 * local_a40._16_4_;
    fVar268 = local_560._20_4_;
    auVar266._20_4_ = fVar268 * local_a40._20_4_;
    fVar269 = local_560._24_4_;
    auVar266._24_4_ = fVar269 * local_a40._24_4_;
    auVar266._28_4_ = local_a00._28_4_;
    auVar222 = vfmsub231ps_fma(auVar266,local_9a0,local_520);
    auVar192._0_4_ = fVar171 * fVar171;
    auVar192._4_4_ = fVar172 * fVar172;
    auVar192._8_4_ = fVar173 * fVar173;
    auVar192._12_4_ = fVar174 * fVar174;
    auVar192._16_4_ = fVar214 * fVar214;
    auVar192._20_4_ = fVar215 * fVar215;
    auVar192._24_4_ = fVar240 * fVar240;
    auVar192._28_4_ = 0;
    auVar183 = vfmadd231ps_fma(auVar192,local_560,local_560);
    auVar183 = vfmadd231ps_fma(ZEXT1632(auVar183),local_540,local_540);
    auVar100 = vrcpps_avx(ZEXT1632(auVar183));
    auVar222 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar222),ZEXT1632(auVar222));
    auVar275._8_4_ = 0x3f800000;
    auVar275._0_8_ = &DAT_3f8000003f800000;
    auVar275._12_4_ = 0x3f800000;
    auVar275._16_4_ = 0x3f800000;
    auVar275._20_4_ = 0x3f800000;
    auVar275._24_4_ = 0x3f800000;
    auVar275._28_4_ = 0x3f800000;
    auVar94 = vfnmadd213ps_fma(auVar100,ZEXT1632(auVar183),auVar275);
    auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar100,auVar100);
    local_9c0 = vpermps_avx2(_DAT_0205d4a0,local_a20);
    local_900 = vpermps_avx2(_DAT_0205d4a0,local_a40);
    auVar6._4_4_ = local_9c0._4_4_ * fVar172;
    auVar6._0_4_ = local_9c0._0_4_ * fVar171;
    auVar6._8_4_ = local_9c0._8_4_ * fVar173;
    auVar6._12_4_ = local_9c0._12_4_ * fVar174;
    auVar6._16_4_ = local_9c0._16_4_ * fVar214;
    auVar6._20_4_ = local_9c0._20_4_ * fVar215;
    auVar6._24_4_ = local_9c0._24_4_ * fVar240;
    auVar6._28_4_ = auVar100._28_4_;
    auVar160 = vfmsub231ps_fma(auVar6,local_900,local_540);
    auVar194 = vpermps_avx2(_DAT_0205d4a0,local_9a0);
    auVar7._4_4_ = fVar281 * auVar194._4_4_;
    auVar7._0_4_ = fVar270 * auVar194._0_4_;
    auVar7._8_4_ = fVar285 * auVar194._8_4_;
    auVar7._12_4_ = fVar286 * auVar194._12_4_;
    auVar7._16_4_ = fVar287 * auVar194._16_4_;
    auVar7._20_4_ = fVar288 * auVar194._20_4_;
    auVar7._24_4_ = fVar289 * auVar194._24_4_;
    auVar7._28_4_ = 0;
    auVar96 = vfmsub231ps_fma(auVar7,local_9c0,local_560);
    auVar160 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar96._12_4_ * auVar96._12_4_,
                                                  CONCAT48(auVar96._8_4_ * auVar96._8_4_,
                                                           CONCAT44(auVar96._4_4_ * auVar96._4_4_,
                                                                    auVar96._0_4_ * auVar96._0_4_)))
                                       ),ZEXT1632(auVar160),ZEXT1632(auVar160));
    fVar86 = local_900._0_4_;
    auVar226._0_4_ = fVar199 * fVar86;
    fVar258 = local_900._4_4_;
    auVar226._4_4_ = fVar210 * fVar258;
    fVar259 = local_900._8_4_;
    auVar226._8_4_ = fVar211 * fVar259;
    fVar260 = local_900._12_4_;
    auVar226._12_4_ = fVar212 * fVar260;
    fVar291 = local_900._16_4_;
    auVar226._16_4_ = fVar213 * fVar291;
    fVar292 = local_900._20_4_;
    auVar226._20_4_ = fVar268 * fVar292;
    fVar293 = local_900._24_4_;
    auVar226._24_4_ = fVar269 * fVar293;
    auVar226._28_4_ = 0;
    auVar96 = vfmsub231ps_fma(auVar226,auVar194,local_520);
    auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),ZEXT1632(auVar96),ZEXT1632(auVar96));
    auVar100 = vmaxps_avx(ZEXT1632(CONCAT412(auVar222._12_4_ * auVar94._12_4_,
                                             CONCAT48(auVar222._8_4_ * auVar94._8_4_,
                                                      CONCAT44(auVar222._4_4_ * auVar94._4_4_,
                                                               auVar222._0_4_ * auVar94._0_4_)))),
                          ZEXT1632(CONCAT412(auVar160._12_4_ * auVar94._12_4_,
                                             CONCAT48(auVar160._8_4_ * auVar94._8_4_,
                                                      CONCAT44(auVar160._4_4_ * auVar94._4_4_,
                                                               auVar160._0_4_ * auVar94._0_4_)))));
    local_760._0_4_ = auVar88._0_4_ + fVar118;
    local_760._4_4_ = auVar88._4_4_ + fVar153;
    local_760._8_4_ = auVar88._8_4_ + fVar154;
    local_760._12_4_ = auVar88._12_4_ + fVar155;
    local_760._16_4_ = fVar156 + 0.0;
    local_760._20_4_ = fVar157 + 0.0;
    local_760._24_4_ = fVar158 + 0.0;
    local_760._28_4_ = auVar114._28_4_ + 0.0;
    local_740 = ZEXT1632(auVar88);
    auVar114 = vsubps_avx(local_740,auVar11);
    local_780 = vpermps_avx2(_DAT_0205d4a0,auVar114);
    auVar11 = vpermps_avx2(_DAT_0205d4a0,local_740);
    auVar114 = vmaxps_avx(local_740,local_760);
    auVar103 = vmaxps_avx(local_780,auVar11);
    auVar9 = vrsqrtps_avx(ZEXT1632(auVar183));
    auVar114 = vmaxps_avx(auVar114,auVar103);
    fVar118 = auVar9._0_4_;
    fVar153 = auVar9._4_4_;
    fVar158 = auVar9._8_4_;
    fVar154 = auVar9._12_4_;
    fVar155 = auVar9._16_4_;
    fVar156 = auVar9._20_4_;
    fVar157 = auVar9._24_4_;
    auVar8._4_4_ = fVar153 * fVar153 * fVar153 * auVar183._4_4_ * -0.5;
    auVar8._0_4_ = fVar118 * fVar118 * fVar118 * auVar183._0_4_ * -0.5;
    auVar8._8_4_ = fVar158 * fVar158 * fVar158 * auVar183._8_4_ * -0.5;
    auVar8._12_4_ = fVar154 * fVar154 * fVar154 * auVar183._12_4_ * -0.5;
    auVar8._16_4_ = fVar155 * fVar155 * fVar155 * -0.0;
    auVar8._20_4_ = fVar156 * fVar156 * fVar156 * -0.0;
    auVar8._24_4_ = fVar157 * fVar157 * fVar157 * -0.0;
    auVar8._28_4_ = auVar194._28_4_;
    auVar102._8_4_ = 0x3fc00000;
    auVar102._0_8_ = 0x3fc000003fc00000;
    auVar102._12_4_ = 0x3fc00000;
    auVar102._16_4_ = 0x3fc00000;
    auVar102._20_4_ = 0x3fc00000;
    auVar102._24_4_ = 0x3fc00000;
    auVar102._28_4_ = 0x3fc00000;
    auVar94 = vfmadd231ps_fma(auVar8,auVar102,auVar9);
    auVar263 = ZEXT1664(auVar94);
    fVar153 = auVar94._0_4_;
    fVar158 = auVar94._4_4_;
    auVar13._4_4_ = fVar210 * fVar158;
    auVar13._0_4_ = fVar199 * fVar153;
    fVar155 = auVar94._8_4_;
    auVar13._8_4_ = fVar211 * fVar155;
    fVar157 = auVar94._12_4_;
    auVar13._12_4_ = fVar212 * fVar157;
    auVar13._16_4_ = fVar213 * 0.0;
    auVar13._20_4_ = fVar268 * 0.0;
    auVar13._24_4_ = fVar269 * 0.0;
    auVar13._28_4_ = 0;
    auVar14._4_4_ = (float)local_840._4_4_ * fVar158 * fVar172;
    auVar14._0_4_ = (float)local_840._0_4_ * fVar153 * fVar171;
    auVar14._8_4_ = fStack_838 * fVar155 * fVar173;
    auVar14._12_4_ = fStack_834 * fVar157 * fVar174;
    auVar14._16_4_ = fStack_830 * fVar214 * 0.0;
    auVar14._20_4_ = fStack_82c * fVar215 * 0.0;
    auVar14._24_4_ = fStack_828 * fVar240 * 0.0;
    auVar14._28_4_ = local_560._28_4_;
    auVar94 = vfmadd231ps_fma(auVar14,auVar13,_local_800);
    _local_640 = ZEXT1632(auVar120);
    auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar10 = vsubps_avx(auVar103,_local_640);
    fVar199 = auVar10._0_4_;
    auVar278._0_4_ = fVar199 * fVar153 * fVar171;
    fVar210 = auVar10._4_4_;
    auVar278._4_4_ = fVar210 * fVar158 * fVar172;
    fVar211 = auVar10._8_4_;
    auVar278._8_4_ = fVar211 * fVar155 * fVar173;
    fVar212 = auVar10._12_4_;
    auVar278._12_4_ = fVar212 * fVar157 * fVar174;
    fVar213 = auVar10._16_4_;
    auVar278._16_4_ = fVar213 * fVar214 * 0.0;
    fVar214 = auVar10._20_4_;
    auVar278._20_4_ = fVar214 * fVar215 * 0.0;
    fVar215 = auVar10._24_4_;
    auVar278._24_4_ = fVar215 * fVar240 * 0.0;
    auVar278._28_4_ = 0;
    auVar166 = vsubps_avx(auVar103,auVar101);
    auVar183 = vfmadd231ps_fma(auVar278,auVar166,auVar13);
    auVar15._4_4_ = fVar281 * fVar158;
    auVar15._0_4_ = fVar270 * fVar153;
    auVar15._8_4_ = fVar285 * fVar155;
    auVar15._12_4_ = fVar286 * fVar157;
    auVar15._16_4_ = fVar287 * 0.0;
    auVar15._20_4_ = fVar288 * 0.0;
    auVar15._24_4_ = fVar289 * 0.0;
    auVar15._28_4_ = auVar9._28_4_;
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar15,_local_7e0);
    auVar267 = ZEXT1664(auVar94);
    auVar104 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar228 = vsubps_avx(auVar104,auVar191);
    auVar183 = vfmadd231ps_fma(ZEXT1632(auVar183),auVar228,auVar15);
    auVar16._4_4_ = (float)local_840._4_4_ * fVar210;
    auVar16._0_4_ = (float)local_840._0_4_ * fVar199;
    auVar16._8_4_ = fStack_838 * fVar211;
    auVar16._12_4_ = fStack_834 * fVar212;
    auVar16._16_4_ = fStack_830 * fVar213;
    auVar16._20_4_ = fStack_82c * fVar214;
    auVar16._24_4_ = fStack_828 * fVar215;
    auVar16._28_4_ = auVar9._28_4_;
    auVar222 = vfmadd231ps_fma(auVar16,_local_800,auVar166);
    auVar222 = vfmadd231ps_fma(ZEXT1632(auVar222),_local_7e0,auVar228);
    fVar118 = auVar183._0_4_;
    fVar240 = auVar94._0_4_;
    fVar154 = auVar183._4_4_;
    fVar268 = auVar94._4_4_;
    fVar156 = auVar183._8_4_;
    fVar269 = auVar94._8_4_;
    fVar171 = auVar183._12_4_;
    fVar270 = auVar94._12_4_;
    auVar17._28_4_ = local_7e0._28_4_;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(fVar270 * fVar171,
                            CONCAT48(fVar269 * fVar156,CONCAT44(fVar268 * fVar154,fVar240 * fVar118)
                                    )));
    auVar9 = vsubps_avx(ZEXT1632(auVar222),auVar17);
    auVar18._4_4_ = fVar210 * fVar210;
    auVar18._0_4_ = fVar199 * fVar199;
    auVar18._8_4_ = fVar211 * fVar211;
    auVar18._12_4_ = fVar212 * fVar212;
    auVar18._16_4_ = fVar213 * fVar213;
    auVar18._20_4_ = fVar214 * fVar214;
    auVar18._24_4_ = fVar215 * fVar215;
    auVar18._28_4_ = local_7e0._28_4_;
    auVar222 = vfmadd231ps_fma(auVar18,auVar166,auVar166);
    auVar222 = vfmadd231ps_fma(ZEXT1632(auVar222),auVar228,auVar228);
    auVar19._28_4_ = uStack_824;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(fVar171 * fVar171,
                            CONCAT48(fVar156 * fVar156,CONCAT44(fVar154 * fVar154,fVar118 * fVar118)
                                    )));
    auVar273 = ZEXT3264(auVar19);
    local_600 = vsubps_avx(ZEXT1632(auVar222),auVar19);
    auVar249 = ZEXT3264(local_600);
    auVar103 = vsqrtps_avx(auVar100);
    fVar118 = (auVar114._0_4_ + auVar103._0_4_) * 1.0000002;
    fVar154 = (auVar114._4_4_ + auVar103._4_4_) * 1.0000002;
    fVar156 = (auVar114._8_4_ + auVar103._8_4_) * 1.0000002;
    fVar171 = (auVar114._12_4_ + auVar103._12_4_) * 1.0000002;
    fVar172 = (auVar114._16_4_ + auVar103._16_4_) * 1.0000002;
    fVar173 = (auVar114._20_4_ + auVar103._20_4_) * 1.0000002;
    fVar174 = (auVar114._24_4_ + auVar103._24_4_) * 1.0000002;
    auVar20._4_4_ = fVar154 * fVar154;
    auVar20._0_4_ = fVar118 * fVar118;
    auVar20._8_4_ = fVar156 * fVar156;
    auVar20._12_4_ = fVar171 * fVar171;
    auVar20._16_4_ = fVar172 * fVar172;
    auVar20._20_4_ = fVar173 * fVar173;
    auVar20._24_4_ = fVar174 * fVar174;
    auVar20._28_4_ = auVar114._28_4_ + auVar103._28_4_;
    fVar281 = auVar9._0_4_ + auVar9._0_4_;
    fVar285 = auVar9._4_4_ + auVar9._4_4_;
    local_3c0._0_8_ = CONCAT44(fVar285,fVar281);
    local_3c0._8_4_ = auVar9._8_4_ + auVar9._8_4_;
    local_3c0._12_4_ = auVar9._12_4_ + auVar9._12_4_;
    local_3c0._16_4_ = auVar9._16_4_ + auVar9._16_4_;
    local_3c0._20_4_ = auVar9._20_4_ + auVar9._20_4_;
    local_3c0._24_4_ = auVar9._24_4_ + auVar9._24_4_;
    fVar118 = auVar9._28_4_;
    local_3c0._28_4_ = fVar118 + fVar118;
    auVar9 = vsubps_avx(local_600,auVar20);
    auVar266 = ZEXT1632(auVar94);
    local_5a0._28_4_ = auVar114._28_4_;
    local_5a0._0_28_ =
         ZEXT1628(CONCAT412(fVar270 * fVar270,
                            CONCAT48(fVar269 * fVar269,CONCAT44(fVar268 * fVar268,fVar240 * fVar240)
                                    )));
    auVar114 = vsubps_avx(local_2e0,local_5a0);
    auVar21._4_4_ = fVar285 * fVar285;
    auVar21._0_4_ = fVar281 * fVar281;
    auVar21._8_4_ = local_3c0._8_4_ * local_3c0._8_4_;
    auVar21._12_4_ = local_3c0._12_4_ * local_3c0._12_4_;
    auVar21._16_4_ = local_3c0._16_4_ * local_3c0._16_4_;
    auVar21._20_4_ = local_3c0._20_4_ * local_3c0._20_4_;
    auVar21._24_4_ = local_3c0._24_4_ * local_3c0._24_4_;
    auVar21._28_4_ = fVar118;
    fVar154 = auVar114._0_4_;
    local_620._0_4_ = fVar154 * 4.0;
    fVar156 = auVar114._4_4_;
    local_620._4_4_ = fVar156 * 4.0;
    fVar171 = auVar114._8_4_;
    fStack_618 = fVar171 * 4.0;
    fVar172 = auVar114._12_4_;
    fStack_614 = fVar172 * 4.0;
    fVar173 = auVar114._16_4_;
    fStack_610 = fVar173 * 4.0;
    fVar174 = auVar114._20_4_;
    fStack_60c = fVar174 * 4.0;
    fVar240 = auVar114._24_4_;
    fStack_608 = fVar240 * 4.0;
    uStack_604 = 0x40800000;
    auVar22._4_4_ = auVar9._4_4_ * (float)local_620._4_4_;
    auVar22._0_4_ = auVar9._0_4_ * (float)local_620._0_4_;
    auVar22._8_4_ = auVar9._8_4_ * fStack_618;
    auVar22._12_4_ = auVar9._12_4_ * fStack_614;
    auVar22._16_4_ = auVar9._16_4_ * fStack_610;
    auVar22._20_4_ = auVar9._20_4_ * fStack_60c;
    auVar22._24_4_ = auVar9._24_4_ * fStack_608;
    auVar22._28_4_ = 0x40800000;
    auVar195 = vsubps_avx(auVar21,auVar22);
    auVar100 = vcmpps_avx(auVar195,auVar104,5);
    auVar104 = ZEXT1632(auVar183);
    fVar118 = auVar114._28_4_;
    if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar100 >> 0x7f,0) == '\0') &&
          (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar100 >> 0xbf,0) == '\0') &&
        (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar100[0x1f])
    {
      fStack_b18 = INFINITY;
      local_b20 = (undefined1  [8])0x7f8000007f800000;
      fStack_b14 = INFINITY;
      uStack_b10 = 0x7f800000;
      uStack_b0c = 0x7f800000;
      uStack_b08 = 0x7f800000;
      uStack_b04 = 0x7f800000;
      auVar233 = ZEXT3264(CONCAT428(0xff800000,
                                    CONCAT424(0xff800000,
                                              CONCAT420(0xff800000,
                                                        CONCAT416(0xff800000,
                                                                  CONCAT412(0xff800000,
                                                                            CONCAT48(0xff800000,
                                                                                                                                                                          
                                                  0xff800000ff800000)))))));
    }
    else {
      auVar8 = vsqrtps_avx(auVar195);
      auVar257 = ZEXT3264(auVar114);
      auVar244._0_4_ = fVar154 + fVar154;
      auVar244._4_4_ = fVar156 + fVar156;
      auVar244._8_4_ = fVar171 + fVar171;
      auVar244._12_4_ = fVar172 + fVar172;
      auVar244._16_4_ = fVar173 + fVar173;
      auVar244._20_4_ = fVar174 + fVar174;
      auVar244._24_4_ = fVar240 + fVar240;
      auVar244._28_4_ = fVar118 + fVar118;
      auVar7 = vrcpps_avx(auVar244);
      auVar6 = vcmpps_avx(auVar195,ZEXT432(0) << 0x20,5);
      auVar273 = ZEXT3264(auVar6);
      auVar227._8_4_ = 0x3f800000;
      auVar227._0_8_ = &DAT_3f8000003f800000;
      auVar227._12_4_ = 0x3f800000;
      auVar227._16_4_ = 0x3f800000;
      auVar227._20_4_ = 0x3f800000;
      auVar227._24_4_ = 0x3f800000;
      auVar227._28_4_ = 0x3f800000;
      auVar94 = vfnmadd213ps_fma(auVar244,auVar7,auVar227);
      auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar7,auVar7);
      auVar105._0_8_ = CONCAT44(fVar285,fVar281) ^ 0x8000000080000000;
      auVar105._8_4_ = -local_3c0._8_4_;
      auVar105._12_4_ = -local_3c0._12_4_;
      auVar105._16_4_ = -local_3c0._16_4_;
      auVar105._20_4_ = -local_3c0._20_4_;
      auVar105._24_4_ = -local_3c0._24_4_;
      auVar105._28_4_ = -local_3c0._28_4_;
      auVar195 = vsubps_avx(auVar105,auVar8);
      auVar23._4_4_ = auVar195._4_4_ * auVar94._4_4_;
      auVar23._0_4_ = auVar195._0_4_ * auVar94._0_4_;
      auVar23._8_4_ = auVar195._8_4_ * auVar94._8_4_;
      auVar23._12_4_ = auVar195._12_4_ * auVar94._12_4_;
      auVar23._16_4_ = auVar195._16_4_ * 0.0;
      auVar23._20_4_ = auVar195._20_4_ * 0.0;
      auVar23._24_4_ = auVar195._24_4_ * 0.0;
      auVar23._28_4_ = auVar195._28_4_;
      auVar195 = vsubps_avx(auVar8,local_3c0);
      auVar24._4_4_ = auVar195._4_4_ * auVar94._4_4_;
      auVar24._0_4_ = auVar195._0_4_ * auVar94._0_4_;
      auVar24._8_4_ = auVar195._8_4_ * auVar94._8_4_;
      auVar24._12_4_ = auVar195._12_4_ * auVar94._12_4_;
      auVar24._16_4_ = auVar195._16_4_ * 0.0;
      auVar24._20_4_ = auVar195._20_4_ * 0.0;
      auVar24._24_4_ = auVar195._24_4_ * 0.0;
      auVar24._28_4_ = auVar195._28_4_;
      auVar94 = vfmadd213ps_fma(auVar266,auVar23,auVar104);
      local_4e0 = ZEXT1632(CONCAT412(fVar157 * auVar94._12_4_,
                                     CONCAT48(fVar155 * auVar94._8_4_,
                                              CONCAT44(fVar158 * auVar94._4_4_,
                                                       fVar153 * auVar94._0_4_))));
      auVar94 = vfmadd213ps_fma(auVar266,auVar24,auVar104);
      local_500 = ZEXT1632(CONCAT412(fVar157 * auVar94._12_4_,
                                     CONCAT48(fVar155 * auVar94._8_4_,
                                              CONCAT44(fVar158 * auVar94._4_4_,
                                                       fVar153 * auVar94._0_4_))));
      auVar237._8_4_ = 0x7f800000;
      auVar237._0_8_ = 0x7f8000007f800000;
      auVar237._12_4_ = 0x7f800000;
      auVar237._16_4_ = 0x7f800000;
      auVar237._20_4_ = 0x7f800000;
      auVar237._24_4_ = 0x7f800000;
      auVar237._28_4_ = 0x7f800000;
      _local_b20 = vblendvps_avx(auVar237,auVar23,auVar6);
      auVar60._4_4_ = uStack_85c;
      auVar60._0_4_ = local_860;
      auVar60._8_4_ = uStack_858;
      auVar60._12_4_ = uStack_854;
      auVar60._16_4_ = uStack_850;
      auVar60._20_4_ = uStack_84c;
      auVar60._24_4_ = uStack_848;
      auVar60._28_4_ = uStack_844;
      auVar195 = vandps_avx(local_5a0,auVar60);
      auVar195 = vmaxps_avx(local_4a0,auVar195);
      auVar249 = ZEXT3264(CONCAT428(0x36000000,
                                    CONCAT424(0x36000000,
                                              CONCAT420(0x36000000,
                                                        CONCAT416(0x36000000,
                                                                  CONCAT412(0x36000000,
                                                                            CONCAT48(0x36000000,
                                                                                                                                                                          
                                                  0x3600000036000000)))))));
      auVar25._4_4_ = auVar195._4_4_ * 1.9073486e-06;
      auVar25._0_4_ = auVar195._0_4_ * 1.9073486e-06;
      auVar25._8_4_ = auVar195._8_4_ * 1.9073486e-06;
      auVar25._12_4_ = auVar195._12_4_ * 1.9073486e-06;
      auVar25._16_4_ = auVar195._16_4_ * 1.9073486e-06;
      auVar25._20_4_ = auVar195._20_4_ * 1.9073486e-06;
      auVar25._24_4_ = auVar195._24_4_ * 1.9073486e-06;
      auVar25._28_4_ = auVar195._28_4_;
      auVar195 = vandps_avx(auVar114,auVar60);
      auVar7 = vcmpps_avx(auVar195,auVar25,1);
      auVar106._8_4_ = 0xff800000;
      auVar106._0_8_ = 0xff800000ff800000;
      auVar106._12_4_ = 0xff800000;
      auVar106._16_4_ = 0xff800000;
      auVar106._20_4_ = 0xff800000;
      auVar106._24_4_ = 0xff800000;
      auVar106._28_4_ = 0xff800000;
      auVar195 = vblendvps_avx(auVar106,auVar24,auVar6);
      auVar233 = ZEXT3264(auVar195);
      auVar8 = auVar6 & auVar7;
      if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0x7f,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar8 >> 0xbf,0) != '\0') ||
          (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar8[0x1f] < '\0')
      {
        auVar100 = vandps_avx(auVar6,auVar7);
        auVar7 = vcmpps_avx(auVar9,ZEXT832(0) << 0x20,2);
        auVar255._8_4_ = 0xff800000;
        auVar255._0_8_ = 0xff800000ff800000;
        auVar255._12_4_ = 0xff800000;
        auVar255._16_4_ = 0xff800000;
        auVar255._20_4_ = 0xff800000;
        auVar255._24_4_ = 0xff800000;
        auVar255._28_4_ = 0xff800000;
        auVar257 = ZEXT3264(auVar255);
        auVar247._8_4_ = 0x7f800000;
        auVar247._0_8_ = 0x7f8000007f800000;
        auVar247._12_4_ = 0x7f800000;
        auVar247._16_4_ = 0x7f800000;
        auVar247._20_4_ = 0x7f800000;
        auVar247._24_4_ = 0x7f800000;
        auVar247._28_4_ = 0x7f800000;
        auVar9 = vblendvps_avx(auVar247,auVar255,auVar7);
        auVar94 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
        auVar8 = vpmovsxwd_avx2(auVar94);
        _local_b20 = vblendvps_avx(_local_b20,auVar9,auVar8);
        auVar248._8_4_ = 0x7f800000;
        auVar248._0_8_ = 0x7f8000007f800000;
        auVar248._12_4_ = 0x7f800000;
        auVar248._16_4_ = 0x7f800000;
        auVar248._20_4_ = 0x7f800000;
        auVar248._24_4_ = 0x7f800000;
        auVar248._28_4_ = 0x7f800000;
        auVar9 = vblendvps_avx(auVar255,auVar248,auVar7);
        auVar249 = ZEXT3264(auVar9);
        auVar9 = vblendvps_avx(auVar195,auVar9,auVar8);
        auVar233 = ZEXT3264(auVar9);
        auVar116._0_8_ = auVar100._0_8_ ^ 0xffffffffffffffff;
        auVar116._8_4_ = auVar100._8_4_ ^ 0xffffffff;
        auVar116._12_4_ = auVar100._12_4_ ^ 0xffffffff;
        auVar116._16_4_ = auVar100._16_4_ ^ 0xffffffff;
        auVar116._20_4_ = auVar100._20_4_ ^ 0xffffffff;
        auVar116._24_4_ = auVar100._24_4_ ^ 0xffffffff;
        auVar116._28_4_ = auVar100._28_4_ ^ 0xffffffff;
        auVar100 = vorps_avx(auVar7,auVar116);
        auVar100 = vandps_avx(auVar6,auVar100);
      }
    }
    auVar290 = ZEXT3264(local_380);
    auVar9 = local_380 & auVar100;
    if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0x7f,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar9 >> 0xbf,0) != '\0') ||
        (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0') {
      fVar268 = *(float *)(ray + k * 4 + 0x80) - (float)local_8a0._0_4_;
      auVar107._4_4_ = fVar268;
      auVar107._0_4_ = fVar268;
      auVar107._8_4_ = fVar268;
      auVar107._12_4_ = fVar268;
      auVar107._16_4_ = fVar268;
      auVar107._20_4_ = fVar268;
      auVar107._24_4_ = fVar268;
      auVar107._28_4_ = fVar268;
      local_580 = vminps_avx(auVar107,auVar233._0_32_);
      auVar26._4_4_ = fVar210 * local_a40._4_4_;
      auVar26._0_4_ = fVar199 * (float)local_a40._0_4_;
      auVar26._8_4_ = fVar211 * local_a40._8_4_;
      auVar26._12_4_ = fVar212 * local_a40._12_4_;
      auVar26._16_4_ = fVar213 * local_a40._16_4_;
      auVar26._20_4_ = fVar214 * local_a40._20_4_;
      auVar26._24_4_ = fVar215 * local_a40._24_4_;
      auVar26._28_4_ = auVar10._28_4_;
      auVar94 = vfmadd213ps_fma(auVar166,local_9a0,auVar26);
      auVar183 = vfmadd213ps_fma(auVar228,local_a20,ZEXT1632(auVar94));
      auVar27._4_4_ = local_a40._4_4_ * (float)local_840._4_4_;
      auVar27._0_4_ = (float)local_a40._0_4_ * (float)local_840._0_4_;
      auVar27._8_4_ = local_a40._8_4_ * fStack_838;
      auVar27._12_4_ = local_a40._12_4_ * fStack_834;
      auVar27._16_4_ = local_a40._16_4_ * fStack_830;
      auVar27._20_4_ = local_a40._20_4_ * fStack_82c;
      auVar27._24_4_ = local_a40._24_4_ * fStack_828;
      auVar27._28_4_ = 0;
      auVar257 = ZEXT3264(_local_800);
      auVar94 = vfmadd231ps_fma(auVar27,_local_800,local_9a0);
      auVar222 = vfmadd231ps_fma(ZEXT1632(auVar94),_local_7e0,local_a20);
      auVar61._4_4_ = uStack_85c;
      auVar61._0_4_ = local_860;
      auVar61._8_4_ = uStack_858;
      auVar61._12_4_ = uStack_854;
      auVar61._16_4_ = uStack_850;
      auVar61._20_4_ = uStack_84c;
      auVar61._24_4_ = uStack_848;
      auVar61._28_4_ = uStack_844;
      auVar9 = vandps_avx(auVar61,ZEXT1632(auVar222));
      auVar207._8_4_ = 0x219392ef;
      auVar207._0_8_ = 0x219392ef219392ef;
      auVar207._12_4_ = 0x219392ef;
      auVar207._16_4_ = 0x219392ef;
      auVar207._20_4_ = 0x219392ef;
      auVar207._24_4_ = 0x219392ef;
      auVar207._28_4_ = 0x219392ef;
      auVar10 = vcmpps_avx(auVar9,auVar207,1);
      auVar9 = vrcpps_avx(ZEXT1632(auVar222));
      auVar284._8_4_ = 0x3f800000;
      auVar284._0_8_ = &DAT_3f8000003f800000;
      auVar284._12_4_ = 0x3f800000;
      auVar284._16_4_ = 0x3f800000;
      auVar284._20_4_ = 0x3f800000;
      auVar284._24_4_ = 0x3f800000;
      auVar284._28_4_ = 0x3f800000;
      auVar228 = ZEXT1632(auVar222);
      auVar94 = vfnmadd213ps_fma(auVar9,auVar228,auVar284);
      auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar9,auVar9);
      auVar193._0_8_ = auVar222._0_8_ ^ 0x8000000080000000;
      auVar193._8_4_ = auVar222._8_4_ ^ 0x80000000;
      auVar193._12_4_ = auVar222._12_4_ ^ 0x80000000;
      auVar193._16_4_ = 0x80000000;
      auVar193._20_4_ = 0x80000000;
      auVar193._24_4_ = 0x80000000;
      auVar193._28_4_ = 0x80000000;
      auVar245._0_4_ = auVar94._0_4_ * -auVar183._0_4_;
      auVar245._4_4_ = auVar94._4_4_ * -auVar183._4_4_;
      auVar245._8_4_ = auVar94._8_4_ * -auVar183._8_4_;
      auVar245._12_4_ = auVar94._12_4_ * -auVar183._12_4_;
      auVar245._16_4_ = 0x80000000;
      auVar245._20_4_ = 0x80000000;
      auVar245._24_4_ = 0x80000000;
      auVar245._28_4_ = 0;
      auVar9 = vcmpps_avx(auVar228,auVar193,1);
      auVar9 = vorps_avx(auVar10,auVar9);
      auVar272._8_4_ = 0xff800000;
      auVar272._0_8_ = 0xff800000ff800000;
      auVar272._12_4_ = 0xff800000;
      auVar272._16_4_ = 0xff800000;
      auVar272._20_4_ = 0xff800000;
      auVar272._24_4_ = 0xff800000;
      auVar272._28_4_ = 0xff800000;
      auVar9 = vblendvps_avx(auVar245,auVar272,auVar9);
      auVar65._4_4_ = fStack_39c;
      auVar65._0_4_ = local_3a0;
      auVar65._8_4_ = fStack_398;
      auVar65._12_4_ = fStack_394;
      auVar65._16_4_ = fStack_390;
      auVar65._20_4_ = fStack_38c;
      auVar65._24_4_ = fStack_388;
      auVar65._28_4_ = fStack_384;
      auVar166 = vmaxps_avx(auVar65,_local_b20);
      auVar166 = vmaxps_avx(auVar166,auVar9);
      auVar9 = vcmpps_avx(auVar228,auVar193,6);
      auVar9 = vorps_avx(auVar10,auVar9);
      auVar229._8_4_ = 0x7f800000;
      auVar229._0_8_ = 0x7f8000007f800000;
      auVar229._12_4_ = 0x7f800000;
      auVar229._16_4_ = 0x7f800000;
      auVar229._20_4_ = 0x7f800000;
      auVar229._24_4_ = 0x7f800000;
      auVar229._28_4_ = 0x7f800000;
      auVar9 = vblendvps_avx(auVar245,auVar229,auVar9);
      auVar228 = vminps_avx(local_580,auVar9);
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_a00);
      auVar10 = vsubps_avx(ZEXT832(0) << 0x20,local_720);
      auVar28._4_4_ = auVar10._4_4_ * fVar258;
      auVar28._0_4_ = auVar10._0_4_ * fVar86;
      auVar28._8_4_ = auVar10._8_4_ * fVar259;
      auVar28._12_4_ = auVar10._12_4_ * fVar260;
      auVar28._16_4_ = auVar10._16_4_ * fVar291;
      auVar28._20_4_ = auVar10._20_4_ * fVar292;
      auVar28._24_4_ = auVar10._24_4_ * fVar293;
      auVar28._28_4_ = auVar10._28_4_;
      auVar94 = vfnmsub231ps_fma(auVar28,auVar194,auVar9);
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_8e0._0_32_);
      auVar183 = vfnmadd231ps_fma(ZEXT1632(auVar94),local_9c0,auVar9);
      auVar29._4_4_ = fVar258 * (float)local_840._4_4_;
      auVar29._0_4_ = fVar86 * (float)local_840._0_4_;
      auVar29._8_4_ = fVar259 * fStack_838;
      auVar29._12_4_ = fVar260 * fStack_834;
      auVar29._16_4_ = fVar291 * fStack_830;
      auVar29._20_4_ = fVar292 * fStack_82c;
      auVar29._24_4_ = fVar293 * fStack_828;
      auVar29._28_4_ = auVar9._28_4_;
      auVar94 = vfnmsub231ps_fma(auVar29,_local_800,auVar194);
      auVar222 = vfnmadd231ps_fma(ZEXT1632(auVar94),_local_7e0,local_9c0);
      auVar9 = vandps_avx(auVar61,ZEXT1632(auVar222));
      auVar195 = vrcpps_avx(ZEXT1632(auVar222));
      auVar108._8_4_ = 0x219392ef;
      auVar108._0_8_ = 0x219392ef219392ef;
      auVar108._12_4_ = 0x219392ef;
      auVar108._16_4_ = 0x219392ef;
      auVar108._20_4_ = 0x219392ef;
      auVar108._24_4_ = 0x219392ef;
      auVar108._28_4_ = 0x219392ef;
      auVar10 = vcmpps_avx(auVar9,auVar108,1);
      auVar194 = ZEXT1632(auVar222);
      auVar94 = vfnmadd213ps_fma(auVar195,auVar194,auVar284);
      auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar195,auVar195);
      auVar246._0_8_ = auVar222._0_8_ ^ 0x8000000080000000;
      auVar246._8_4_ = auVar222._8_4_ ^ 0x80000000;
      auVar246._12_4_ = auVar222._12_4_ ^ 0x80000000;
      auVar246._16_4_ = 0x80000000;
      auVar246._20_4_ = 0x80000000;
      auVar246._24_4_ = 0x80000000;
      auVar246._28_4_ = 0x80000000;
      auVar249 = ZEXT3264(auVar246);
      auVar30._4_4_ = auVar94._4_4_ * -auVar183._4_4_;
      auVar30._0_4_ = auVar94._0_4_ * -auVar183._0_4_;
      auVar30._8_4_ = auVar94._8_4_ * -auVar183._8_4_;
      auVar30._12_4_ = auVar94._12_4_ * -auVar183._12_4_;
      auVar30._16_4_ = 0x80000000;
      auVar30._20_4_ = 0x80000000;
      auVar30._24_4_ = 0x80000000;
      auVar30._28_4_ = 0x80000000;
      auVar233 = ZEXT3264(auVar30);
      auVar9 = vcmpps_avx(auVar194,auVar246,1);
      auVar9 = vorps_avx(auVar9,auVar10);
      auVar109._8_4_ = 0xff800000;
      auVar109._0_8_ = 0xff800000ff800000;
      auVar109._12_4_ = 0xff800000;
      auVar109._16_4_ = 0xff800000;
      auVar109._20_4_ = 0xff800000;
      auVar109._24_4_ = 0xff800000;
      auVar109._28_4_ = 0xff800000;
      auVar9 = vblendvps_avx(auVar30,auVar109,auVar9);
      local_a60 = vmaxps_avx(auVar166,auVar9);
      auVar273 = ZEXT3264(local_a60);
      auVar9 = vcmpps_avx(auVar194,auVar246,6);
      auVar9 = vorps_avx(auVar10,auVar9);
      auVar110._8_4_ = 0x7f800000;
      auVar110._0_8_ = 0x7f8000007f800000;
      auVar110._12_4_ = 0x7f800000;
      auVar110._16_4_ = 0x7f800000;
      auVar110._20_4_ = 0x7f800000;
      auVar110._24_4_ = 0x7f800000;
      auVar110._28_4_ = 0x7f800000;
      auVar9 = vblendvps_avx(auVar30,auVar110,auVar9);
      auVar100 = vandps_avx(local_380,auVar100);
      local_3e0 = vminps_avx(auVar228,auVar9);
      auVar9 = vcmpps_avx(local_a60,local_3e0,2);
      auVar10 = auVar100 & auVar9;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar10 = vminps_avx(local_4e0,auVar284);
        auVar10 = vmaxps_avx(auVar10,ZEXT832(0) << 0x20);
        auVar166 = vminps_avx(local_500,auVar284);
        auVar166 = vmaxps_avx(auVar166,ZEXT832(0) << 0x20);
        auVar31._4_4_ = (auVar10._4_4_ + 1.0) * 0.125;
        auVar31._0_4_ = (auVar10._0_4_ + 0.0) * 0.125;
        auVar31._8_4_ = (auVar10._8_4_ + 2.0) * 0.125;
        auVar31._12_4_ = (auVar10._12_4_ + 3.0) * 0.125;
        auVar31._16_4_ = (auVar10._16_4_ + 4.0) * 0.125;
        auVar31._20_4_ = (auVar10._20_4_ + 5.0) * 0.125;
        auVar31._24_4_ = (auVar10._24_4_ + 6.0) * 0.125;
        auVar31._28_4_ = auVar10._28_4_ + 7.0;
        auVar94 = vfmadd213ps_fma(auVar31,local_920,local_940);
        auVar32._4_4_ = (auVar166._4_4_ + 1.0) * 0.125;
        auVar32._0_4_ = (auVar166._0_4_ + 0.0) * 0.125;
        auVar32._8_4_ = (auVar166._8_4_ + 2.0) * 0.125;
        auVar32._12_4_ = (auVar166._12_4_ + 3.0) * 0.125;
        auVar32._16_4_ = (auVar166._16_4_ + 4.0) * 0.125;
        auVar32._20_4_ = (auVar166._20_4_ + 5.0) * 0.125;
        auVar32._24_4_ = (auVar166._24_4_ + 6.0) * 0.125;
        auVar32._28_4_ = auVar166._28_4_ + 7.0;
        auVar183 = vfmadd213ps_fma(auVar32,local_920,local_940);
        auVar10 = vminps_avx(local_740,local_760);
        auVar166 = vminps_avx(local_780,auVar11);
        auVar10 = vminps_avx(auVar10,auVar166);
        auVar103 = vsubps_avx(auVar10,auVar103);
        auVar100 = vandps_avx(auVar9,auVar100);
        local_4e0 = ZEXT1632(auVar94);
        local_500 = ZEXT1632(auVar183);
        auVar33._4_4_ = auVar103._4_4_ * 0.99999976;
        auVar33._0_4_ = auVar103._0_4_ * 0.99999976;
        auVar33._8_4_ = auVar103._8_4_ * 0.99999976;
        auVar33._12_4_ = auVar103._12_4_ * 0.99999976;
        auVar33._16_4_ = auVar103._16_4_ * 0.99999976;
        auVar33._20_4_ = auVar103._20_4_ * 0.99999976;
        auVar33._24_4_ = auVar103._24_4_ * 0.99999976;
        auVar33._28_4_ = 0x3f7ffffc;
        auVar103 = vmaxps_avx(ZEXT832(0) << 0x20,auVar33);
        auVar34._4_4_ = auVar103._4_4_ * auVar103._4_4_;
        auVar34._0_4_ = auVar103._0_4_ * auVar103._0_4_;
        auVar34._8_4_ = auVar103._8_4_ * auVar103._8_4_;
        auVar34._12_4_ = auVar103._12_4_ * auVar103._12_4_;
        auVar34._16_4_ = auVar103._16_4_ * auVar103._16_4_;
        auVar34._20_4_ = auVar103._20_4_ * auVar103._20_4_;
        auVar34._24_4_ = auVar103._24_4_ * auVar103._24_4_;
        auVar34._28_4_ = auVar103._28_4_;
        auVar9 = vsubps_avx(local_600,auVar34);
        auVar273 = ZEXT3264(auVar9);
        auVar35._4_4_ = auVar9._4_4_ * (float)local_620._4_4_;
        auVar35._0_4_ = auVar9._0_4_ * (float)local_620._0_4_;
        auVar35._8_4_ = auVar9._8_4_ * fStack_618;
        auVar35._12_4_ = auVar9._12_4_ * fStack_614;
        auVar35._16_4_ = auVar9._16_4_ * fStack_610;
        auVar35._20_4_ = auVar9._20_4_ * fStack_60c;
        auVar35._24_4_ = auVar9._24_4_ * fStack_608;
        auVar35._28_4_ = auVar103._28_4_;
        auVar10 = vsubps_avx(auVar21,auVar35);
        auVar47 = ZEXT412(0);
        auVar166 = ZEXT1232(auVar47) << 0x20;
        local_880 = ZEXT1232(auVar47) << 0x20;
        auVar103 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,5);
        auVar290 = ZEXT3264(auVar103);
        if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar103 >> 0x7f,0) == '\0') &&
              (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar103 >> 0xbf,0) == '\0') &&
            (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar103[0x1f]) {
          _local_620 = local_880;
          _local_640 = ZEXT1232(auVar47) << 0x20;
          auVar195 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar206 = ZEXT828(0) << 0x20;
          auVar230._8_4_ = 0x7f800000;
          auVar230._0_8_ = 0x7f8000007f800000;
          auVar230._12_4_ = 0x7f800000;
          auVar230._16_4_ = 0x7f800000;
          auVar230._20_4_ = 0x7f800000;
          auVar230._24_4_ = 0x7f800000;
          auVar230._28_4_ = 0x7f800000;
          auVar238._8_4_ = 0xff800000;
          auVar238._0_8_ = 0xff800000ff800000;
          auVar238._12_4_ = 0xff800000;
          auVar238._16_4_ = 0xff800000;
          auVar238._20_4_ = 0xff800000;
          auVar238._24_4_ = 0xff800000;
          auVar238._28_4_ = 0xff800000;
        }
        else {
          auVar165._0_4_ = fVar154 + fVar154;
          auVar165._4_4_ = fVar156 + fVar156;
          auVar165._8_4_ = fVar171 + fVar171;
          auVar165._12_4_ = fVar172 + fVar172;
          auVar165._16_4_ = fVar173 + fVar173;
          auVar165._20_4_ = fVar174 + fVar174;
          auVar165._24_4_ = fVar240 + fVar240;
          auVar165._28_4_ = fVar118 + fVar118;
          auVar166 = vrcpps_avx(auVar165);
          auVar94 = vfnmadd213ps_fma(auVar165,auVar166,auVar284);
          auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar166,auVar166);
          auVar166 = vsqrtps_avx(auVar10);
          auVar208._0_8_ = local_3c0._0_8_ ^ 0x8000000080000000;
          auVar208._8_4_ = -local_3c0._8_4_;
          auVar208._12_4_ = -local_3c0._12_4_;
          auVar208._16_4_ = -local_3c0._16_4_;
          auVar208._20_4_ = -local_3c0._20_4_;
          auVar208._24_4_ = -local_3c0._24_4_;
          auVar208._28_4_ = -local_3c0._28_4_;
          auVar228 = vsubps_avx(auVar208,auVar166);
          auVar166 = vsubps_avx(auVar166,local_3c0);
          fVar171 = auVar228._0_4_ * auVar94._0_4_;
          fVar291 = auVar228._4_4_ * auVar94._4_4_;
          auVar36._4_4_ = fVar291;
          auVar36._0_4_ = fVar171;
          fVar292 = auVar228._8_4_ * auVar94._8_4_;
          auVar36._8_4_ = fVar292;
          fVar293 = auVar228._12_4_ * auVar94._12_4_;
          auVar36._12_4_ = fVar293;
          fVar172 = auVar228._16_4_ * 0.0;
          auVar36._16_4_ = fVar172;
          fVar173 = auVar228._20_4_ * 0.0;
          auVar36._20_4_ = fVar173;
          fVar174 = auVar228._24_4_ * 0.0;
          auVar36._24_4_ = fVar174;
          auVar36._28_4_ = auVar103._28_4_;
          fVar118 = auVar166._0_4_ * auVar94._0_4_;
          fVar86 = auVar166._4_4_ * auVar94._4_4_;
          auVar37._4_4_ = fVar86;
          auVar37._0_4_ = fVar118;
          fVar258 = auVar166._8_4_ * auVar94._8_4_;
          auVar37._8_4_ = fVar258;
          fVar154 = auVar166._12_4_ * auVar94._12_4_;
          auVar37._12_4_ = fVar154;
          fVar259 = auVar166._16_4_ * 0.0;
          auVar37._16_4_ = fVar259;
          fVar156 = auVar166._20_4_ * 0.0;
          auVar37._20_4_ = fVar156;
          fVar260 = auVar166._24_4_ * 0.0;
          auVar37._24_4_ = fVar260;
          auVar37._28_4_ = local_800._28_4_;
          auVar94 = vfmadd213ps_fma(auVar266,auVar36,auVar104);
          auVar183 = vfmadd213ps_fma(auVar266,auVar37,auVar104);
          auVar38._28_4_ = auVar228._28_4_;
          auVar38._0_28_ =
               ZEXT1628(CONCAT412(fVar157 * auVar94._12_4_,
                                  CONCAT48(fVar155 * auVar94._8_4_,
                                           CONCAT44(fVar158 * auVar94._4_4_,fVar153 * auVar94._0_4_)
                                          )));
          auVar166 = ZEXT1632(CONCAT412(fVar157 * auVar183._12_4_,
                                        CONCAT48(fVar155 * auVar183._8_4_,
                                                 CONCAT44(fVar158 * auVar183._4_4_,
                                                          fVar153 * auVar183._0_4_))));
          auVar94 = vfmadd213ps_fma(local_540,auVar38,auVar191);
          auVar183 = vfmadd213ps_fma(local_540,auVar166,auVar191);
          auVar222 = vfmadd213ps_fma(local_560,auVar38,auVar101);
          auVar160 = vfmadd213ps_fma(local_560,auVar166,auVar101);
          auVar96 = vfmadd213ps_fma(auVar38,local_520,_local_640);
          auVar277 = vfmadd213ps_fma(local_520,auVar166,_local_640);
          auVar39._4_4_ = fVar291 * (float)local_7e0._4_4_;
          auVar39._0_4_ = fVar171 * (float)local_7e0._0_4_;
          auVar39._8_4_ = fVar292 * fStack_7d8;
          auVar39._12_4_ = fVar293 * fStack_7d4;
          auVar39._16_4_ = fVar172 * fStack_7d0;
          auVar39._20_4_ = fVar173 * fStack_7cc;
          auVar39._24_4_ = fVar174 * fStack_7c8;
          auVar39._28_4_ = 0;
          auVar166 = vsubps_avx(auVar39,ZEXT1632(auVar94));
          auVar196._0_4_ = fVar171 * (float)local_800._0_4_;
          auVar196._4_4_ = fVar291 * (float)local_800._4_4_;
          auVar196._8_4_ = fVar292 * fStack_7f8;
          auVar196._12_4_ = fVar293 * fStack_7f4;
          auVar196._16_4_ = fVar172 * fStack_7f0;
          auVar196._20_4_ = fVar173 * fStack_7ec;
          auVar196._24_4_ = fVar174 * fStack_7e8;
          auVar196._28_4_ = 0;
          auVar195 = vsubps_avx(auVar196,ZEXT1632(auVar222));
          auVar231._0_4_ = (float)local_840._0_4_ * fVar171;
          auVar231._4_4_ = (float)local_840._4_4_ * fVar291;
          auVar231._8_4_ = fStack_838 * fVar292;
          auVar231._12_4_ = fStack_834 * fVar293;
          auVar231._16_4_ = fStack_830 * fVar172;
          auVar231._20_4_ = fStack_82c * fVar173;
          auVar231._24_4_ = fStack_828 * fVar174;
          auVar231._28_4_ = 0;
          auVar228 = vsubps_avx(auVar231,ZEXT1632(auVar96));
          auVar206 = auVar228._0_28_;
          auVar40._4_4_ = fVar86 * (float)local_7e0._4_4_;
          auVar40._0_4_ = fVar118 * (float)local_7e0._0_4_;
          auVar40._8_4_ = fVar258 * fStack_7d8;
          auVar40._12_4_ = fVar154 * fStack_7d4;
          auVar40._16_4_ = fVar259 * fStack_7d0;
          auVar40._20_4_ = fVar156 * fStack_7cc;
          auVar40._24_4_ = fVar260 * fStack_7c8;
          auVar40._28_4_ = 0;
          local_880 = vsubps_avx(auVar40,ZEXT1632(auVar183));
          auVar41._4_4_ = fVar86 * (float)local_800._4_4_;
          auVar41._0_4_ = fVar118 * (float)local_800._0_4_;
          auVar41._8_4_ = fVar258 * fStack_7f8;
          auVar41._12_4_ = fVar154 * fStack_7f4;
          auVar41._16_4_ = fVar259 * fStack_7f0;
          auVar41._20_4_ = fVar156 * fStack_7ec;
          auVar41._24_4_ = fVar260 * fStack_7e8;
          auVar41._28_4_ = local_880._28_4_;
          _local_620 = vsubps_avx(auVar41,ZEXT1632(auVar160));
          auVar42._4_4_ = (float)local_840._4_4_ * fVar86;
          auVar42._0_4_ = (float)local_840._0_4_ * fVar118;
          auVar42._8_4_ = fStack_838 * fVar258;
          auVar42._12_4_ = fStack_834 * fVar154;
          auVar42._16_4_ = fStack_830 * fVar259;
          auVar42._20_4_ = fStack_82c * fVar156;
          auVar42._24_4_ = fStack_828 * fVar260;
          auVar42._28_4_ = local_620._28_4_;
          _local_640 = vsubps_avx(auVar42,ZEXT1632(auVar277));
          auVar267 = ZEXT864(0) << 0x20;
          auVar228 = vcmpps_avx(auVar10,_DAT_02020f00,5);
          auVar232._8_4_ = 0x7f800000;
          auVar232._0_8_ = 0x7f8000007f800000;
          auVar232._12_4_ = 0x7f800000;
          auVar232._16_4_ = 0x7f800000;
          auVar232._20_4_ = 0x7f800000;
          auVar232._24_4_ = 0x7f800000;
          auVar232._28_4_ = 0x7f800000;
          auVar230 = vblendvps_avx(auVar232,auVar36,auVar228);
          auVar62._4_4_ = uStack_85c;
          auVar62._0_4_ = local_860;
          auVar62._8_4_ = uStack_858;
          auVar62._12_4_ = uStack_854;
          auVar62._16_4_ = uStack_850;
          auVar62._20_4_ = uStack_84c;
          auVar62._24_4_ = uStack_848;
          auVar62._28_4_ = uStack_844;
          auVar10 = vandps_avx(auVar62,local_5a0);
          auVar10 = vmaxps_avx(local_4a0,auVar10);
          auVar43._4_4_ = auVar10._4_4_ * 1.9073486e-06;
          auVar43._0_4_ = auVar10._0_4_ * 1.9073486e-06;
          auVar43._8_4_ = auVar10._8_4_ * 1.9073486e-06;
          auVar43._12_4_ = auVar10._12_4_ * 1.9073486e-06;
          auVar43._16_4_ = auVar10._16_4_ * 1.9073486e-06;
          auVar43._20_4_ = auVar10._20_4_ * 1.9073486e-06;
          auVar43._24_4_ = auVar10._24_4_ * 1.9073486e-06;
          auVar43._28_4_ = auVar10._28_4_;
          auVar114 = vandps_avx(auVar62,auVar114);
          auVar114 = vcmpps_avx(auVar114,auVar43,1);
          auVar239._8_4_ = 0xff800000;
          auVar239._0_8_ = 0xff800000ff800000;
          auVar239._12_4_ = 0xff800000;
          auVar239._16_4_ = 0xff800000;
          auVar239._20_4_ = 0xff800000;
          auVar239._24_4_ = 0xff800000;
          auVar239._28_4_ = 0xff800000;
          auVar238 = vblendvps_avx(auVar239,auVar37,auVar228);
          auVar10 = auVar228 & auVar114;
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar10 >> 0x7f,0) == '\0') &&
                (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar10 >> 0xbf,0) == '\0') &&
              (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar10[0x1f]) {
            auVar290 = ZEXT3264(auVar103);
          }
          else {
            auVar114 = vandps_avx(auVar114,auVar228);
            auVar9 = vcmpps_avx(auVar9,ZEXT832(0) << 0x20,2);
            auVar267 = ZEXT3264(auVar9);
            auVar276._8_4_ = 0xff800000;
            auVar276._0_8_ = 0xff800000ff800000;
            auVar276._12_4_ = 0xff800000;
            auVar276._16_4_ = 0xff800000;
            auVar276._20_4_ = 0xff800000;
            auVar276._24_4_ = 0xff800000;
            auVar276._28_4_ = 0xff800000;
            auVar279._8_4_ = 0x7f800000;
            auVar279._0_8_ = 0x7f8000007f800000;
            auVar279._12_4_ = 0x7f800000;
            auVar279._16_4_ = 0x7f800000;
            auVar279._20_4_ = 0x7f800000;
            auVar279._24_4_ = 0x7f800000;
            auVar279._28_4_ = 0x7f800000;
            auVar103 = vblendvps_avx(auVar279,auVar276,auVar9);
            auVar94 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
            auVar10 = vpmovsxwd_avx2(auVar94);
            auVar230 = vblendvps_avx(auVar230,auVar103,auVar10);
            auVar103 = vblendvps_avx(auVar276,auVar279,auVar9);
            auVar273 = ZEXT3264(auVar103);
            auVar238 = vblendvps_avx(auVar238,auVar103,auVar10);
            auVar256._0_8_ = auVar114._0_8_ ^ 0xffffffffffffffff;
            auVar256._8_4_ = auVar114._8_4_ ^ 0xffffffff;
            auVar256._12_4_ = auVar114._12_4_ ^ 0xffffffff;
            auVar256._16_4_ = auVar114._16_4_ ^ 0xffffffff;
            auVar256._20_4_ = auVar114._20_4_ ^ 0xffffffff;
            auVar256._24_4_ = auVar114._24_4_ ^ 0xffffffff;
            auVar256._28_4_ = auVar114._28_4_ ^ 0xffffffff;
            auVar114 = vorps_avx(auVar9,auVar256);
            auVar114 = vandps_avx(auVar114,auVar228);
            auVar290 = ZEXT3264(auVar114);
          }
        }
        auVar263 = ZEXT3264(local_a60);
        local_440 = local_a60;
        local_420 = vminps_avx(local_3e0,auVar230);
        _local_400 = vmaxps_avx(local_a60,auVar238);
        auVar257 = ZEXT3264(_local_400);
        auVar114 = vcmpps_avx(local_a60,local_420,2);
        local_520 = vandps_avx(auVar114,auVar100);
        auVar233 = ZEXT3264(local_520);
        local_5c0 = local_520;
        auVar114 = vcmpps_avx(_local_400,local_3e0,2);
        local_5e0 = vandps_avx(auVar114,auVar100);
        auVar249 = ZEXT3264(local_5e0);
        auVar100 = vorps_avx(local_5e0,local_520);
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0x7f,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0xbf,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar100[0x1f] < '\0') {
          local_560 = local_5e0;
          local_580._0_8_ = auVar290._0_8_ ^ 0xffffffffffffffff;
          local_580._8_4_ = auVar290._8_4_ ^ 0xffffffff;
          local_580._12_4_ = auVar290._12_4_ ^ 0xffffffff;
          local_580._16_4_ = auVar290._16_4_ ^ 0xffffffff;
          local_580._20_4_ = auVar290._20_4_ ^ 0xffffffff;
          local_580._24_4_ = auVar290._24_4_ ^ 0xffffffff;
          local_580._28_4_ = auVar290._28_4_ ^ 0xffffffff;
          auVar233 = ZEXT3264(local_580);
          auVar44._4_4_ = auVar206._4_4_ * (float)local_840._4_4_;
          auVar44._0_4_ = auVar206._0_4_ * (float)local_840._0_4_;
          auVar44._8_4_ = auVar206._8_4_ * fStack_838;
          auVar44._12_4_ = auVar206._12_4_ * fStack_834;
          auVar44._16_4_ = auVar206._16_4_ * fStack_830;
          auVar44._20_4_ = auVar206._20_4_ * fStack_82c;
          auVar44._24_4_ = auVar206._24_4_ * fStack_828;
          auVar44._28_4_ = auVar100._28_4_;
          auVar94 = vfmadd132ps_fma(auVar195,auVar44,_local_800);
          auVar94 = vfmadd132ps_fma(auVar166,ZEXT1632(auVar94),_local_7e0);
          auVar63._4_4_ = uStack_85c;
          auVar63._0_4_ = local_860;
          auVar63._8_4_ = uStack_858;
          auVar63._12_4_ = uStack_854;
          auVar63._16_4_ = uStack_850;
          auVar63._20_4_ = uStack_84c;
          auVar63._24_4_ = uStack_848;
          auVar63._28_4_ = uStack_844;
          auVar100 = vandps_avx(ZEXT1632(auVar94),auVar63);
          auVar143._8_4_ = 0x3e99999a;
          auVar143._0_8_ = 0x3e99999a3e99999a;
          auVar143._12_4_ = 0x3e99999a;
          auVar143._16_4_ = 0x3e99999a;
          auVar143._20_4_ = 0x3e99999a;
          auVar143._24_4_ = 0x3e99999a;
          auVar143._28_4_ = 0x3e99999a;
          auVar100 = vcmpps_avx(auVar100,auVar143,1);
          auVar100 = vorps_avx(auVar100,local_580);
          auVar144._8_4_ = 3;
          auVar144._0_8_ = 0x300000003;
          auVar144._12_4_ = 3;
          auVar144._16_4_ = 3;
          auVar144._20_4_ = 3;
          auVar144._24_4_ = 3;
          auVar144._28_4_ = 3;
          auVar167._8_4_ = 2;
          auVar167._0_8_ = 0x200000002;
          auVar167._12_4_ = 2;
          auVar167._16_4_ = 2;
          auVar167._20_4_ = 2;
          auVar167._24_4_ = 2;
          auVar167._28_4_ = 2;
          auVar100 = vblendvps_avx(auVar167,auVar144,auVar100);
          uVar81 = (undefined4)uVar82;
          local_5a0._4_4_ = uVar81;
          local_5a0._0_4_ = uVar81;
          local_5a0._8_4_ = uVar81;
          local_5a0._12_4_ = uVar81;
          local_5a0._16_4_ = uVar81;
          local_5a0._20_4_ = uVar81;
          local_5a0._24_4_ = uVar81;
          local_5a0._28_4_ = uVar81;
          local_540 = vpcmpgtd_avx2(auVar100,local_5a0);
          local_5c0 = vpandn_avx2(local_540,local_520);
          auVar100 = local_520 & ~local_540;
          local_600._0_8_ = uVar82;
          if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar100 >> 0x7f,0) != '\0') ||
                (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0xbf,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar100[0x1f] < '\0') {
            auVar183 = vminps_avx(local_aa0,local_ac0);
            auVar94 = vmaxps_avx(local_aa0,local_ac0);
            auVar222 = vminps_avx(local_ab0,_local_ad0);
            auVar160 = vminps_avx(auVar183,auVar222);
            auVar183 = vmaxps_avx(local_ab0,_local_ad0);
            auVar222 = vmaxps_avx(auVar94,auVar183);
            auVar94 = vandps_avx(auVar160,local_960);
            auVar183 = vandps_avx(auVar222,local_960);
            auVar94 = vmaxps_avx(auVar94,auVar183);
            auVar183 = vmovshdup_avx(auVar94);
            auVar183 = vmaxss_avx(auVar183,auVar94);
            auVar94 = vshufpd_avx(auVar94,auVar94,1);
            auVar94 = vmaxss_avx(auVar94,auVar183);
            local_8e0._0_4_ = auVar94._0_4_ * 1.9073486e-06;
            _local_7c0 = vshufps_avx(auVar222,auVar222,0xff);
            _auStack_7b0 = auVar11._16_16_;
            local_820._4_4_ = local_a60._4_4_ + (float)local_7a0._4_4_;
            local_820._0_4_ = local_a60._0_4_ + (float)local_7a0._0_4_;
            fStack_818 = local_a60._8_4_ + fStack_798;
            fStack_814 = local_a60._12_4_ + fStack_794;
            fStack_810 = local_a60._16_4_ + fStack_790;
            fStack_80c = local_a60._20_4_ + fStack_78c;
            fStack_808 = local_a60._24_4_ + fStack_788;
            fStack_804 = local_a60._28_4_ + fStack_784;
            local_940 = _local_400;
            do {
              auVar145._8_4_ = 0x7f800000;
              auVar145._0_8_ = 0x7f8000007f800000;
              auVar145._12_4_ = 0x7f800000;
              auVar145._16_4_ = 0x7f800000;
              auVar145._20_4_ = 0x7f800000;
              auVar145._24_4_ = 0x7f800000;
              auVar145._28_4_ = 0x7f800000;
              auVar100 = vblendvps_avx(auVar145,auVar263._0_32_,local_5c0);
              auVar114 = vshufps_avx(auVar100,auVar100,0xb1);
              auVar114 = vminps_avx(auVar100,auVar114);
              auVar103 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar103);
              auVar103 = vpermpd_avx2(auVar114,0x4e);
              auVar114 = vminps_avx(auVar114,auVar103);
              auVar114 = vcmpps_avx(auVar100,auVar114,0);
              auVar103 = local_5c0 & auVar114;
              auVar100 = local_5c0;
              if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar103 >> 0x7f,0) != '\0') ||
                    (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar103 >> 0xbf,0) != '\0') ||
                  (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar103[0x1f] < '\0') {
                auVar100 = vandps_avx(auVar114,local_5c0);
              }
              uVar77 = vmovmskps_avx(auVar100);
              iVar12 = 0;
              for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                iVar12 = iVar12 + 1;
              }
              uVar78 = iVar12 << 2;
              *(undefined4 *)(local_5c0 + uVar78) = 0;
              uVar77 = *(uint *)(local_4e0 + uVar78);
              uVar78 = *(uint *)(local_440 + uVar78);
              fVar118 = local_ad4;
              if ((float)local_970._0_4_ < 0.0) {
                fVar118 = sqrtf((float)local_970._0_4_);
              }
              auVar267 = ZEXT464(uVar78);
              auVar263 = ZEXT464(uVar77);
              local_900._0_4_ = fVar118 * 1.9073486e-06;
              lVar83 = 4;
              do {
                fVar153 = auVar263._0_4_;
                fVar86 = 1.0 - fVar153;
                local_a00._0_16_ = ZEXT416((uint)fVar86);
                auVar122._0_4_ = local_ac0._0_4_ * fVar153;
                auVar122._4_4_ = local_ac0._4_4_ * fVar153;
                auVar122._8_4_ = local_ac0._8_4_ * fVar153;
                auVar122._12_4_ = local_ac0._12_4_ * fVar153;
                auVar159._4_4_ = fVar86;
                auVar159._0_4_ = fVar86;
                auVar159._8_4_ = fVar86;
                auVar159._12_4_ = fVar86;
                auVar94 = vfmadd231ps_fma(auVar122,auVar159,local_aa0);
                auVar176._0_4_ = local_ab0._0_4_ * fVar153;
                auVar176._4_4_ = local_ab0._4_4_ * fVar153;
                auVar176._8_4_ = local_ab0._8_4_ * fVar153;
                auVar176._12_4_ = local_ab0._12_4_ * fVar153;
                auVar183 = vfmadd231ps_fma(auVar176,auVar159,local_ac0);
                auVar221._0_4_ = fVar153 * auVar183._0_4_;
                auVar221._4_4_ = fVar153 * auVar183._4_4_;
                auVar221._8_4_ = fVar153 * auVar183._8_4_;
                auVar221._12_4_ = fVar153 * auVar183._12_4_;
                auVar222 = vfmadd231ps_fma(auVar221,auVar159,auVar94);
                auVar123._0_4_ = fVar153 * (float)local_ad0._0_4_;
                auVar123._4_4_ = fVar153 * (float)local_ad0._4_4_;
                auVar123._8_4_ = fVar153 * fStack_ac8;
                auVar123._12_4_ = fVar153 * fStack_ac4;
                auVar94 = vfmadd231ps_fma(auVar123,auVar159,local_ab0);
                auVar202._0_4_ = fVar153 * auVar94._0_4_;
                auVar202._4_4_ = fVar153 * auVar94._4_4_;
                auVar202._8_4_ = fVar153 * auVar94._8_4_;
                auVar202._12_4_ = fVar153 * auVar94._12_4_;
                auVar160 = vfmadd231ps_fma(auVar202,auVar159,auVar183);
                fVar118 = auVar267._0_4_;
                auVar124._4_4_ = fVar118;
                auVar124._0_4_ = fVar118;
                auVar124._8_4_ = fVar118;
                auVar124._12_4_ = fVar118;
                auVar94 = vfmadd213ps_fma(auVar124,local_950,_DAT_01feba10);
                auVar91._0_4_ = fVar153 * auVar160._0_4_;
                auVar91._4_4_ = fVar153 * auVar160._4_4_;
                auVar91._8_4_ = fVar153 * auVar160._8_4_;
                auVar91._12_4_ = fVar153 * auVar160._12_4_;
                auVar183 = vfmadd231ps_fma(auVar91,auVar222,auVar159);
                local_720._0_16_ = auVar183;
                auVar183 = vsubps_avx(auVar94,auVar183);
                auVar94 = vdpps_avx(auVar183,auVar183,0x7f);
                fVar258 = auVar94._0_4_;
                if (fVar258 < 0.0) {
                  local_a00._0_16_ = ZEXT416((uint)fVar86);
                  local_a20._0_16_ = auVar222;
                  local_9a0._0_16_ = auVar160;
                  auVar290._0_4_ = sqrtf(fVar258);
                  auVar290._4_60_ = extraout_var;
                  auVar96 = auVar290._0_16_;
                  auVar160 = local_9a0._0_16_;
                  auVar222 = local_a20._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar94,auVar94);
                }
                auVar222 = vsubps_avx(auVar160,auVar222);
                auVar235._0_4_ = auVar222._0_4_ * 3.0;
                auVar235._4_4_ = auVar222._4_4_ * 3.0;
                auVar235._8_4_ = auVar222._8_4_ * 3.0;
                auVar235._12_4_ = auVar222._12_4_ * 3.0;
                auVar222 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a00._0_16_,
                                           auVar263._0_16_);
                auVar160 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar263._0_16_,
                                           local_a00._0_16_);
                fVar86 = local_a00._0_4_ * 6.0;
                fVar158 = auVar222._0_4_ * 6.0;
                fVar154 = auVar160._0_4_ * 6.0;
                fVar259 = fVar153 * 6.0;
                auVar177._0_4_ = fVar259 * (float)local_ad0._0_4_;
                auVar177._4_4_ = fVar259 * (float)local_ad0._4_4_;
                auVar177._8_4_ = fVar259 * fStack_ac8;
                auVar177._12_4_ = fVar259 * fStack_ac4;
                auVar125._4_4_ = fVar154;
                auVar125._0_4_ = fVar154;
                auVar125._8_4_ = fVar154;
                auVar125._12_4_ = fVar154;
                auVar222 = vfmadd132ps_fma(auVar125,auVar177,local_ab0);
                auVar178._4_4_ = fVar158;
                auVar178._0_4_ = fVar158;
                auVar178._8_4_ = fVar158;
                auVar178._12_4_ = fVar158;
                auVar222 = vfmadd132ps_fma(auVar178,auVar222,local_ac0);
                auVar160 = vdpps_avx(auVar235,auVar235,0x7f);
                auVar126._4_4_ = fVar86;
                auVar126._0_4_ = fVar86;
                auVar126._8_4_ = fVar86;
                auVar126._12_4_ = fVar86;
                auVar90 = vfmadd132ps_fma(auVar126,auVar222,local_aa0);
                auVar222 = vblendps_avx(auVar160,_DAT_01feba10,0xe);
                auVar277 = vrsqrtss_avx(auVar222,auVar222);
                fVar154 = auVar160._0_4_;
                fVar86 = auVar277._0_4_;
                auVar277 = vdpps_avx(auVar235,auVar90,0x7f);
                fVar86 = fVar86 * 1.5 + fVar154 * -0.5 * fVar86 * fVar86 * fVar86;
                auVar127._0_4_ = auVar90._0_4_ * fVar154;
                auVar127._4_4_ = auVar90._4_4_ * fVar154;
                auVar127._8_4_ = auVar90._8_4_ * fVar154;
                auVar127._12_4_ = auVar90._12_4_ * fVar154;
                fVar158 = auVar277._0_4_;
                auVar223._0_4_ = auVar235._0_4_ * fVar158;
                auVar223._4_4_ = auVar235._4_4_ * fVar158;
                auVar223._8_4_ = auVar235._8_4_ * fVar158;
                auVar223._12_4_ = auVar235._12_4_ * fVar158;
                auVar277 = vsubps_avx(auVar127,auVar223);
                auVar222 = vrcpss_avx(auVar222,auVar222);
                auVar90 = vfnmadd213ss_fma(auVar222,auVar160,ZEXT416(0x40000000));
                fVar158 = auVar222._0_4_ * auVar90._0_4_;
                auVar222 = vmaxss_avx(ZEXT416((uint)local_8e0._0_4_),
                                      ZEXT416((uint)(fVar118 * (float)local_900._0_4_)));
                auVar280 = ZEXT1664(auVar222);
                uVar82 = CONCAT44(auVar235._4_4_,auVar235._0_4_);
                local_a40._0_8_ = uVar82 ^ 0x8000000080000000;
                local_a40._8_4_ = -auVar235._8_4_;
                local_a40._12_4_ = -auVar235._12_4_;
                auVar179._0_4_ = fVar86 * auVar277._0_4_ * fVar158;
                auVar179._4_4_ = fVar86 * auVar277._4_4_ * fVar158;
                auVar179._8_4_ = fVar86 * auVar277._8_4_ * fVar158;
                auVar179._12_4_ = fVar86 * auVar277._12_4_ * fVar158;
                local_9c0._0_4_ = auVar235._0_4_ * fVar86;
                local_9c0._4_4_ = auVar235._4_4_ * fVar86;
                local_9c0._8_4_ = auVar235._8_4_ * fVar86;
                local_9c0._12_4_ = auVar235._12_4_ * fVar86;
                local_a00._0_16_ = auVar235;
                local_a20._0_4_ = auVar222._0_4_;
                if (fVar154 < -fVar154) {
                  local_9a0._0_4_ = auVar96._0_4_;
                  local_920._0_16_ = auVar179;
                  fVar86 = sqrtf(fVar154);
                  auVar96 = ZEXT416((uint)local_9a0._0_4_);
                  auVar280 = ZEXT464((uint)local_a20._0_4_);
                  auVar179 = local_920._0_16_;
                }
                else {
                  auVar222 = vsqrtss_avx(auVar160,auVar160);
                  fVar86 = auVar222._0_4_;
                }
                auVar222 = vdpps_avx(auVar183,local_9c0._0_16_,0x7f);
                auVar89 = vfmadd213ss_fma(ZEXT416((uint)local_8e0._0_4_),auVar96,auVar280._0_16_);
                auVar160 = vdpps_avx(local_a40._0_16_,local_9c0._0_16_,0x7f);
                auVar277 = vdpps_avx(auVar183,auVar179,0x7f);
                auVar90 = vdpps_avx(local_950,local_9c0._0_16_,0x7f);
                auVar120 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_8e0._0_4_ / fVar86)),auVar89)
                ;
                auVar290 = ZEXT1664(auVar120);
                auVar92._0_4_ = auVar222._0_4_ * auVar222._0_4_;
                auVar92._4_4_ = auVar222._4_4_ * auVar222._4_4_;
                auVar92._8_4_ = auVar222._8_4_ * auVar222._8_4_;
                auVar92._12_4_ = auVar222._12_4_ * auVar222._12_4_;
                auVar96 = vdpps_avx(auVar183,local_a40._0_16_,0x7f);
                auVar138 = vsubps_avx(auVar94,auVar92);
                auVar89 = vrsqrtss_avx(auVar138,auVar138);
                fVar158 = auVar138._0_4_;
                fVar86 = auVar89._0_4_;
                fVar86 = fVar86 * 1.5 + fVar158 * -0.5 * fVar86 * fVar86 * fVar86;
                auVar89 = vdpps_avx(auVar183,local_950,0x7f);
                local_9a0._0_16_ = ZEXT416((uint)(auVar160._0_4_ + auVar277._0_4_));
                local_9c0._0_16_ = vfnmadd231ss_fma(auVar96,auVar222,local_9a0._0_16_);
                local_a40._0_16_ = auVar90;
                auVar160 = vfnmadd231ss_fma(auVar89,auVar222,auVar90);
                if (fVar158 < 0.0) {
                  local_920._0_16_ = auVar222;
                  local_740._0_4_ = auVar120._0_4_;
                  local_760._0_4_ = fVar86;
                  local_780._0_16_ = auVar160;
                  fVar158 = sqrtf(fVar158);
                  auVar290 = ZEXT464((uint)local_740._0_4_);
                  auVar280 = ZEXT464((uint)local_a20._0_4_);
                  fVar86 = (float)local_760._0_4_;
                  auVar160 = local_780._0_16_;
                  auVar222 = local_920._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar138,auVar138);
                  fVar158 = auVar96._0_4_;
                }
                auVar249 = ZEXT3264(local_a60);
                auVar257 = ZEXT3264(local_940);
                auVar273 = ZEXT1664(local_a00._0_16_);
                auVar96 = vpermilps_avx(local_720._0_16_,0xff);
                auVar90 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
                auVar277 = vfmsub213ss_fma(local_9c0._0_16_,ZEXT416((uint)fVar86),auVar90);
                auVar180._0_8_ = local_a40._0_8_ ^ 0x8000000080000000;
                auVar180._8_4_ = local_a40._8_4_ ^ 0x80000000;
                auVar180._12_4_ = local_a40._12_4_ ^ 0x80000000;
                auVar203._0_8_ = auVar277._0_8_ ^ 0x8000000080000000;
                auVar203._8_4_ = auVar277._8_4_ ^ 0x80000000;
                auVar203._12_4_ = auVar277._12_4_ ^ 0x80000000;
                auVar160 = ZEXT416((uint)(auVar160._0_4_ * fVar86));
                auVar277 = vfmsub231ss_fma(ZEXT416((uint)(local_a40._0_4_ * auVar277._0_4_)),
                                           local_9a0._0_16_,auVar160);
                auVar160 = vinsertps_avx(auVar160,auVar180,0x10);
                uVar81 = auVar277._0_4_;
                auVar181._4_4_ = uVar81;
                auVar181._0_4_ = uVar81;
                auVar181._8_4_ = uVar81;
                auVar181._12_4_ = uVar81;
                auVar160 = vdivps_avx(auVar160,auVar181);
                auVar89 = ZEXT416((uint)(fVar158 - auVar96._0_4_));
                auVar277 = vinsertps_avx(auVar222,auVar89,0x10);
                auVar233 = ZEXT1664(auVar277);
                auVar161._0_4_ = auVar277._0_4_ * auVar160._0_4_;
                auVar161._4_4_ = auVar277._4_4_ * auVar160._4_4_;
                auVar161._8_4_ = auVar277._8_4_ * auVar160._8_4_;
                auVar161._12_4_ = auVar277._12_4_ * auVar160._12_4_;
                auVar160 = vinsertps_avx(auVar203,local_9a0._0_16_,0x1c);
                auVar160 = vdivps_avx(auVar160,auVar181);
                auVar182._0_4_ = auVar277._0_4_ * auVar160._0_4_;
                auVar182._4_4_ = auVar277._4_4_ * auVar160._4_4_;
                auVar182._8_4_ = auVar277._8_4_ * auVar160._8_4_;
                auVar182._12_4_ = auVar277._12_4_ * auVar160._12_4_;
                auVar160 = vhaddps_avx(auVar161,auVar161);
                auVar96 = vhaddps_avx(auVar182,auVar182);
                fVar153 = fVar153 - auVar160._0_4_;
                auVar263 = ZEXT464((uint)fVar153);
                fVar118 = fVar118 - auVar96._0_4_;
                auVar267 = ZEXT464((uint)fVar118);
                auVar222 = vandps_avx(auVar222,local_960);
                if (auVar290._0_4_ <= auVar222._0_4_) {
LAB_0168e848:
                  bVar46 = false;
                }
                else {
                  auVar160 = vfmadd231ss_fma(ZEXT416((uint)(auVar280._0_4_ + auVar290._0_4_)),
                                             _local_7c0,ZEXT416(0x36000000));
                  auVar222 = vandps_avx(auVar89,local_960);
                  if (auVar160._0_4_ <= auVar222._0_4_) goto LAB_0168e848;
                  fVar118 = fVar118 + (float)local_8a0._0_4_;
                  auVar267 = ZEXT464((uint)fVar118);
                  bVar46 = true;
                  if ((((fVar85 <= fVar118) &&
                       (fVar86 = *(float *)(ray + k * 4 + 0x80), fVar118 <= fVar86)) &&
                      (0.0 <= fVar153)) && (fVar153 <= 1.0)) {
                    auVar94 = vrsqrtss_avx(auVar94,auVar94);
                    fVar158 = auVar94._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar76].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar258 = fVar158 * 1.5 + fVar258 * -0.5 * fVar158 * fVar158 * fVar158;
                      local_b20._0_4_ = auVar183._0_4_;
                      local_b20._4_4_ = auVar183._4_4_;
                      fStack_b18 = auVar183._8_4_;
                      fStack_b14 = auVar183._12_4_;
                      auVar128._0_4_ = fVar258 * (float)local_b20._0_4_;
                      auVar128._4_4_ = fVar258 * (float)local_b20._4_4_;
                      auVar128._8_4_ = fVar258 * fStack_b18;
                      auVar128._12_4_ = fVar258 * fStack_b14;
                      auVar160 = vfmadd213ps_fma(auVar90,auVar128,local_a00._0_16_);
                      auVar94 = vshufps_avx(auVar128,auVar128,0xc9);
                      auVar183 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                      auVar129._0_4_ = auVar128._0_4_ * auVar183._0_4_;
                      auVar129._4_4_ = auVar128._4_4_ * auVar183._4_4_;
                      auVar129._8_4_ = auVar128._8_4_ * auVar183._8_4_;
                      auVar129._12_4_ = auVar128._12_4_ * auVar183._12_4_;
                      auVar222 = vfmsub231ps_fma(auVar129,local_a00._0_16_,auVar94);
                      auVar94 = vshufps_avx(auVar222,auVar222,0xc9);
                      auVar183 = vshufps_avx(auVar160,auVar160,0xc9);
                      auVar222 = vshufps_avx(auVar222,auVar222,0xd2);
                      auVar93._0_4_ = auVar160._0_4_ * auVar222._0_4_;
                      auVar93._4_4_ = auVar160._4_4_ * auVar222._4_4_;
                      auVar93._8_4_ = auVar160._8_4_ * auVar222._8_4_;
                      auVar93._12_4_ = auVar160._12_4_ * auVar222._12_4_;
                      auVar94 = vfmsub231ps_fma(auVar93,auVar94,auVar183);
                      uVar81 = auVar94._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar118;
                        uVar3 = vextractps_avx(auVar94,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                        uVar3 = vextractps_avx(auVar94,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar81;
                        *(float *)(ray + k * 4 + 0xf0) = fVar153;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_9c8;
                        *(uint *)(ray + k * 4 + 0x120) = uVar76;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar130._4_4_ = fVar153;
                        auVar130._0_4_ = fVar153;
                        auVar130._8_4_ = fVar153;
                        auVar130._12_4_ = fVar153;
                        local_6e0 = (RTCHitN  [16])vshufps_avx(auVar94,auVar94,0x55);
                        auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
                        auStack_6d0 = auVar94;
                        local_6c0 = uVar81;
                        uStack_6bc = uVar81;
                        uStack_6b8 = uVar81;
                        uStack_6b4 = uVar81;
                        local_6b0 = auVar130;
                        local_6a0 = ZEXT416(0) << 0x20;
                        local_690 = CONCAT44(uStack_6fc,local_700);
                        uStack_688 = CONCAT44(uStack_6f4,uStack_6f8);
                        local_680._4_4_ = uStack_6ec;
                        local_680._0_4_ = local_6f0;
                        local_680._8_4_ = uStack_6e8;
                        local_680._12_4_ = uStack_6e4;
                        vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                        uStack_66c = context->user->instID[0];
                        local_670 = uStack_66c;
                        uStack_668 = uStack_66c;
                        uStack_664 = uStack_66c;
                        uStack_660 = context->user->instPrimID[0];
                        uStack_65c = uStack_660;
                        uStack_658 = uStack_660;
                        uStack_654 = uStack_660;
                        *(float *)(ray + k * 4 + 0x80) = fVar118;
                        local_af0 = *local_9d0;
                        uStack_ae8 = local_9d0[1];
                        local_a90.valid = (int *)&local_af0;
                        local_a90.geometryUserPtr = pGVar4->userPtr;
                        local_a90.context = context->user;
                        local_a90.hit = local_6e0;
                        local_a90.N = 4;
                        local_a90.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar233 = ZEXT1664(auVar277);
                          auVar273 = ZEXT1664(local_a00._0_16_);
                          auVar290 = ZEXT1664(auVar290._0_16_);
                          (*pGVar4->intersectionFilterN)(&local_a90);
                          auVar257._8_56_ = extraout_var_01;
                          auVar257._0_8_ = extraout_XMM1_Qa;
                          auVar130 = auVar257._0_16_;
                          auVar267 = ZEXT1664(ZEXT416((uint)fVar118));
                          auVar263 = ZEXT1664(ZEXT416((uint)fVar153));
                          auVar257 = ZEXT3264(local_940);
                          auVar249 = ZEXT3264(local_a60);
                        }
                        auVar54._8_8_ = uStack_ae8;
                        auVar54._0_8_ = local_af0;
                        if (auVar54 == (undefined1  [16])0x0) {
                          auVar94 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar183 = vpcmpeqd_avx(auVar130,auVar130);
                          auVar94 = auVar94 ^ auVar183;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar183 = vpcmpeqd_avx(auVar94,auVar94);
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar233 = ZEXT1664(auVar233._0_16_);
                            auVar273 = ZEXT1664(auVar273._0_16_);
                            auVar290 = ZEXT1664(auVar290._0_16_);
                            (*p_Var5)(&local_a90);
                            auVar267 = ZEXT1664(ZEXT416((uint)fVar118));
                            auVar263 = ZEXT1664(ZEXT416((uint)fVar153));
                            auVar257 = ZEXT3264(local_940);
                            auVar249 = ZEXT3264(local_a60);
                            auVar183 = vpcmpeqd_avx(auVar183,auVar183);
                          }
                          auVar55._8_8_ = uStack_ae8;
                          auVar55._0_8_ = local_af0;
                          auVar222 = vpcmpeqd_avx(auVar55,_DAT_01feba10);
                          auVar94 = auVar222 ^ auVar183;
                          if (auVar55 != (undefined1  [16])0x0) {
                            auVar222 = auVar222 ^ auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])local_a90.hit);
                            *(undefined1 (*) [16])(local_a90.ray + 0xc0) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x10));
                            *(undefined1 (*) [16])(local_a90.ray + 0xd0) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x20));
                            *(undefined1 (*) [16])(local_a90.ray + 0xe0) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x30));
                            *(undefined1 (*) [16])(local_a90.ray + 0xf0) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x40));
                            *(undefined1 (*) [16])(local_a90.ray + 0x100) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x50));
                            *(undefined1 (*) [16])(local_a90.ray + 0x110) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x60));
                            *(undefined1 (*) [16])(local_a90.ray + 0x120) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x70));
                            *(undefined1 (*) [16])(local_a90.ray + 0x130) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x80));
                            *(undefined1 (*) [16])(local_a90.ray + 0x140) = auVar183;
                          }
                        }
                        auVar131._8_8_ = 0x100000001;
                        auVar131._0_8_ = 0x100000001;
                        if ((auVar131 & auVar94) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar86;
                        }
                      }
                    }
                  }
                }
                auVar100 = local_5c0;
                bVar84 = lVar83 != 0;
                lVar83 = lVar83 + -1;
              } while ((!bVar46) && (bVar84));
              uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar111._4_4_ = uVar81;
              auVar111._0_4_ = uVar81;
              auVar111._8_4_ = uVar81;
              auVar111._12_4_ = uVar81;
              auVar111._16_4_ = uVar81;
              auVar111._20_4_ = uVar81;
              auVar111._24_4_ = uVar81;
              auVar111._28_4_ = uVar81;
              auVar114 = vcmpps_avx(_local_820,auVar111,2);
              local_5c0 = vandps_avx(auVar114,local_5c0);
              auVar100 = auVar100 & auVar114;
              auVar263 = ZEXT3264(auVar249._0_32_);
              uVar82 = local_600._0_8_;
            } while ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar100 >> 0x7f,0) != '\0') ||
                       (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar100 >> 0xbf,0) != '\0') ||
                     (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar100[0x1f] < '\0');
          }
          auVar45._4_4_ = (float)local_640._4_4_ * (float)local_840._4_4_;
          auVar45._0_4_ = (float)local_640._0_4_ * (float)local_840._0_4_;
          auVar45._8_4_ = fStack_638 * fStack_838;
          auVar45._12_4_ = fStack_634 * fStack_834;
          auVar45._16_4_ = fStack_630 * fStack_830;
          auVar45._20_4_ = fStack_62c * fStack_82c;
          auVar45._24_4_ = fStack_628 * fStack_828;
          auVar45._28_4_ = uStack_624;
          auVar94 = vfmadd132ps_fma(_local_620,auVar45,_local_800);
          auVar94 = vfmadd132ps_fma(local_880,ZEXT1632(auVar94),_local_7e0);
          auVar64._4_4_ = uStack_85c;
          auVar64._0_4_ = local_860;
          auVar64._8_4_ = uStack_858;
          auVar64._12_4_ = uStack_854;
          auVar64._16_4_ = uStack_850;
          auVar64._20_4_ = uStack_84c;
          auVar64._24_4_ = uStack_848;
          auVar64._28_4_ = uStack_844;
          auVar100 = vandps_avx(ZEXT1632(auVar94),auVar64);
          auVar146._8_4_ = 0x3e99999a;
          auVar146._0_8_ = 0x3e99999a3e99999a;
          auVar146._12_4_ = 0x3e99999a;
          auVar146._16_4_ = 0x3e99999a;
          auVar146._20_4_ = 0x3e99999a;
          auVar146._24_4_ = 0x3e99999a;
          auVar146._28_4_ = 0x3e99999a;
          auVar100 = vcmpps_avx(auVar100,auVar146,1);
          auVar114 = vorps_avx(auVar100,local_580);
          auVar147._0_4_ = auVar257._0_4_ + (float)local_7a0._0_4_;
          auVar147._4_4_ = auVar257._4_4_ + (float)local_7a0._4_4_;
          auVar147._8_4_ = auVar257._8_4_ + fStack_798;
          auVar147._12_4_ = auVar257._12_4_ + fStack_794;
          auVar147._16_4_ = auVar257._16_4_ + fStack_790;
          auVar147._20_4_ = auVar257._20_4_ + fStack_78c;
          auVar147._24_4_ = auVar257._24_4_ + fStack_788;
          auVar147._28_4_ = auVar257._28_4_ + fStack_784;
          uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar168._4_4_ = uVar81;
          auVar168._0_4_ = uVar81;
          auVar168._8_4_ = uVar81;
          auVar168._12_4_ = uVar81;
          auVar168._16_4_ = uVar81;
          auVar168._20_4_ = uVar81;
          auVar168._24_4_ = uVar81;
          auVar168._28_4_ = uVar81;
          auVar100 = vcmpps_avx(auVar147,auVar168,2);
          _local_820 = vandps_avx(auVar100,local_560);
          auVar148._8_4_ = 3;
          auVar148._0_8_ = 0x300000003;
          auVar148._12_4_ = 3;
          auVar148._16_4_ = 3;
          auVar148._20_4_ = 3;
          auVar148._24_4_ = 3;
          auVar148._28_4_ = 3;
          auVar169._8_4_ = 2;
          auVar169._0_8_ = 0x200000002;
          auVar169._12_4_ = 2;
          auVar169._16_4_ = 2;
          auVar169._20_4_ = 2;
          auVar169._24_4_ = 2;
          auVar169._28_4_ = 2;
          auVar100 = vblendvps_avx(auVar169,auVar148,auVar114);
          local_880 = vpcmpgtd_avx2(auVar100,local_5a0);
          local_5e0 = vpandn_avx2(local_880,_local_820);
          auVar100 = _local_820 & ~local_880;
          if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar100 >> 0x7f,0) != '\0') ||
                (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0xbf,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar100[0x1f] < '\0') {
            auVar183 = vminps_avx(local_aa0,local_ac0);
            auVar94 = vmaxps_avx(local_aa0,local_ac0);
            auVar222 = vminps_avx(local_ab0,_local_ad0);
            auVar160 = vminps_avx(auVar183,auVar222);
            auVar183 = vmaxps_avx(local_ab0,_local_ad0);
            auVar222 = vmaxps_avx(auVar94,auVar183);
            auVar94 = vandps_avx(auVar160,local_960);
            auVar183 = vandps_avx(auVar222,local_960);
            auVar94 = vmaxps_avx(auVar94,auVar183);
            auVar183 = vmovshdup_avx(auVar94);
            auVar183 = vmaxss_avx(auVar183,auVar94);
            auVar94 = vshufpd_avx(auVar94,auVar94,1);
            auVar94 = vmaxss_avx(auVar94,auVar183);
            local_8e0._0_4_ = auVar94._0_4_ * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar222,auVar222,0xff);
            local_780 = _local_400;
            local_7c0._4_4_ = (float)local_400._4_4_ + (float)local_7a0._4_4_;
            local_7c0._0_4_ = (float)local_400._0_4_ + (float)local_7a0._0_4_;
            fStack_7b8 = fStack_3f8 + fStack_798;
            fStack_7b4 = fStack_3f4 + fStack_794;
            auStack_7b0._0_4_ = fStack_3f0 + fStack_790;
            auStack_7b0._4_4_ = fStack_3ec + fStack_78c;
            fStack_7a8 = fStack_3e8 + fStack_788;
            fStack_7a4 = fStack_3e4 + fStack_784;
            do {
              auVar149._8_4_ = 0x7f800000;
              auVar149._0_8_ = 0x7f8000007f800000;
              auVar149._12_4_ = 0x7f800000;
              auVar149._16_4_ = 0x7f800000;
              auVar149._20_4_ = 0x7f800000;
              auVar149._24_4_ = 0x7f800000;
              auVar149._28_4_ = 0x7f800000;
              auVar100 = vblendvps_avx(auVar149,local_780,local_5e0);
              auVar114 = vshufps_avx(auVar100,auVar100,0xb1);
              auVar114 = vminps_avx(auVar100,auVar114);
              auVar103 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar103);
              auVar103 = vpermpd_avx2(auVar114,0x4e);
              auVar114 = vminps_avx(auVar114,auVar103);
              auVar114 = vcmpps_avx(auVar100,auVar114,0);
              auVar103 = local_5e0 & auVar114;
              auVar100 = local_5e0;
              if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar103 >> 0x7f,0) != '\0') ||
                    (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar103 >> 0xbf,0) != '\0') ||
                  (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar103[0x1f] < '\0') {
                auVar100 = vandps_avx(auVar114,local_5e0);
              }
              uVar77 = vmovmskps_avx(auVar100);
              iVar12 = 0;
              for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                iVar12 = iVar12 + 1;
              }
              uVar78 = iVar12 << 2;
              *(undefined4 *)(local_5e0 + uVar78) = 0;
              uVar77 = *(uint *)(local_500 + uVar78);
              uVar78 = *(uint *)(local_3e0 + uVar78);
              fVar118 = local_ad8;
              if ((float)local_970._0_4_ < 0.0) {
                fVar118 = sqrtf((float)local_970._0_4_);
              }
              auVar249 = ZEXT464(uVar78);
              auVar280 = ZEXT464(uVar77);
              local_9a0._0_4_ = fVar118 * 1.9073486e-06;
              lVar83 = 4;
              do {
                fVar153 = auVar280._0_4_;
                fVar86 = 1.0 - fVar153;
                local_a00._0_16_ = ZEXT416((uint)fVar86);
                auVar132._0_4_ = local_ac0._0_4_ * fVar153;
                auVar132._4_4_ = local_ac0._4_4_ * fVar153;
                auVar132._8_4_ = local_ac0._8_4_ * fVar153;
                auVar132._12_4_ = local_ac0._12_4_ * fVar153;
                auVar162._4_4_ = fVar86;
                auVar162._0_4_ = fVar86;
                auVar162._8_4_ = fVar86;
                auVar162._12_4_ = fVar86;
                auVar94 = vfmadd231ps_fma(auVar132,auVar162,local_aa0);
                auVar184._0_4_ = local_ab0._0_4_ * fVar153;
                auVar184._4_4_ = local_ab0._4_4_ * fVar153;
                auVar184._8_4_ = local_ab0._8_4_ * fVar153;
                auVar184._12_4_ = local_ab0._12_4_ * fVar153;
                auVar183 = vfmadd231ps_fma(auVar184,auVar162,local_ac0);
                auVar224._0_4_ = fVar153 * auVar183._0_4_;
                auVar224._4_4_ = fVar153 * auVar183._4_4_;
                auVar224._8_4_ = fVar153 * auVar183._8_4_;
                auVar224._12_4_ = fVar153 * auVar183._12_4_;
                auVar222 = vfmadd231ps_fma(auVar224,auVar162,auVar94);
                auVar133._0_4_ = fVar153 * (float)local_ad0._0_4_;
                auVar133._4_4_ = fVar153 * (float)local_ad0._4_4_;
                auVar133._8_4_ = fVar153 * fStack_ac8;
                auVar133._12_4_ = fVar153 * fStack_ac4;
                auVar94 = vfmadd231ps_fma(auVar133,auVar162,local_ab0);
                auVar204._0_4_ = fVar153 * auVar94._0_4_;
                auVar204._4_4_ = fVar153 * auVar94._4_4_;
                auVar204._8_4_ = fVar153 * auVar94._8_4_;
                auVar204._12_4_ = fVar153 * auVar94._12_4_;
                auVar160 = vfmadd231ps_fma(auVar204,auVar162,auVar183);
                fVar118 = auVar249._0_4_;
                auVar134._4_4_ = fVar118;
                auVar134._0_4_ = fVar118;
                auVar134._8_4_ = fVar118;
                auVar134._12_4_ = fVar118;
                auVar94 = vfmadd213ps_fma(auVar134,local_950,_DAT_01feba10);
                auVar95._0_4_ = fVar153 * auVar160._0_4_;
                auVar95._4_4_ = fVar153 * auVar160._4_4_;
                auVar95._8_4_ = fVar153 * auVar160._8_4_;
                auVar95._12_4_ = fVar153 * auVar160._12_4_;
                auVar183 = vfmadd231ps_fma(auVar95,auVar222,auVar162);
                local_720._0_16_ = auVar183;
                auVar183 = vsubps_avx(auVar94,auVar183);
                auVar94 = vdpps_avx(auVar183,auVar183,0x7f);
                fVar258 = auVar94._0_4_;
                if (fVar258 < 0.0) {
                  local_a00._0_16_ = ZEXT416((uint)fVar86);
                  local_a20._0_16_ = auVar222;
                  local_a40._0_16_ = auVar160;
                  auVar117._0_4_ = sqrtf(fVar258);
                  auVar117._4_60_ = extraout_var_00;
                  auVar96 = auVar117._0_16_;
                  auVar160 = local_a40._0_16_;
                  auVar222 = local_a20._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar94,auVar94);
                }
                auVar222 = vsubps_avx(auVar160,auVar222);
                auVar253._0_4_ = auVar222._0_4_ * 3.0;
                auVar253._4_4_ = auVar222._4_4_ * 3.0;
                auVar253._8_4_ = auVar222._8_4_ * 3.0;
                auVar253._12_4_ = auVar222._12_4_ * 3.0;
                auVar222 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a00._0_16_,
                                           auVar280._0_16_);
                auVar160 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar280._0_16_,
                                           local_a00._0_16_);
                fVar86 = local_a00._0_4_ * 6.0;
                fVar158 = auVar222._0_4_ * 6.0;
                fVar154 = auVar160._0_4_ * 6.0;
                fVar259 = fVar153 * 6.0;
                auVar185._0_4_ = fVar259 * (float)local_ad0._0_4_;
                auVar185._4_4_ = fVar259 * (float)local_ad0._4_4_;
                auVar185._8_4_ = fVar259 * fStack_ac8;
                auVar185._12_4_ = fVar259 * fStack_ac4;
                auVar135._4_4_ = fVar154;
                auVar135._0_4_ = fVar154;
                auVar135._8_4_ = fVar154;
                auVar135._12_4_ = fVar154;
                auVar222 = vfmadd132ps_fma(auVar135,auVar185,local_ab0);
                auVar186._4_4_ = fVar158;
                auVar186._0_4_ = fVar158;
                auVar186._8_4_ = fVar158;
                auVar186._12_4_ = fVar158;
                auVar222 = vfmadd132ps_fma(auVar186,auVar222,local_ac0);
                auVar160 = vdpps_avx(auVar253,auVar253,0x7f);
                auVar136._4_4_ = fVar86;
                auVar136._0_4_ = fVar86;
                auVar136._8_4_ = fVar86;
                auVar136._12_4_ = fVar86;
                auVar90 = vfmadd132ps_fma(auVar136,auVar222,local_aa0);
                auVar222 = vblendps_avx(auVar160,_DAT_01feba10,0xe);
                auVar277 = vrsqrtss_avx(auVar222,auVar222);
                fVar154 = auVar160._0_4_;
                fVar86 = auVar277._0_4_;
                auVar277 = vdpps_avx(auVar253,auVar90,0x7f);
                fVar86 = fVar86 * 1.5 + fVar154 * -0.5 * fVar86 * fVar86 * fVar86;
                auVar137._0_4_ = auVar90._0_4_ * fVar154;
                auVar137._4_4_ = auVar90._4_4_ * fVar154;
                auVar137._8_4_ = auVar90._8_4_ * fVar154;
                auVar137._12_4_ = auVar90._12_4_ * fVar154;
                fVar158 = auVar277._0_4_;
                auVar225._0_4_ = auVar253._0_4_ * fVar158;
                auVar225._4_4_ = auVar253._4_4_ * fVar158;
                auVar225._8_4_ = auVar253._8_4_ * fVar158;
                auVar225._12_4_ = auVar253._12_4_ * fVar158;
                auVar277 = vsubps_avx(auVar137,auVar225);
                auVar222 = vrcpss_avx(auVar222,auVar222);
                auVar90 = vfnmadd213ss_fma(auVar222,auVar160,ZEXT416(0x40000000));
                fVar158 = auVar222._0_4_ * auVar90._0_4_;
                auVar222 = vmaxss_avx(ZEXT416((uint)local_8e0._0_4_),
                                      ZEXT416((uint)(fVar118 * (float)local_9a0._0_4_)));
                auVar267 = ZEXT1664(auVar222);
                uVar82 = CONCAT44(auVar253._4_4_,auVar253._0_4_);
                auVar236._0_8_ = uVar82 ^ 0x8000000080000000;
                auVar236._8_4_ = -auVar253._8_4_;
                auVar236._12_4_ = -auVar253._12_4_;
                auVar187._0_4_ = fVar86 * auVar277._0_4_ * fVar158;
                auVar187._4_4_ = fVar86 * auVar277._4_4_ * fVar158;
                auVar187._8_4_ = fVar86 * auVar277._8_4_ * fVar158;
                auVar187._12_4_ = fVar86 * auVar277._12_4_ * fVar158;
                auVar242._0_4_ = auVar253._0_4_ * fVar86;
                auVar242._4_4_ = auVar253._4_4_ * fVar86;
                auVar242._8_4_ = auVar253._8_4_ * fVar86;
                auVar242._12_4_ = auVar253._12_4_ * fVar86;
                local_a00._0_16_ = auVar253;
                local_a20._0_4_ = auVar222._0_4_;
                if (fVar154 < -fVar154) {
                  local_a40._0_4_ = auVar96._0_4_;
                  local_9c0._0_16_ = auVar236;
                  local_900._0_16_ = auVar242;
                  local_a60._0_16_ = auVar187;
                  fVar86 = sqrtf(fVar154);
                  auVar96 = ZEXT416((uint)local_a40._0_4_);
                  auVar267 = ZEXT464((uint)local_a20._0_4_);
                  auVar187 = local_a60._0_16_;
                  auVar236 = local_9c0._0_16_;
                  auVar242 = local_900._0_16_;
                }
                else {
                  auVar222 = vsqrtss_avx(auVar160,auVar160);
                  fVar86 = auVar222._0_4_;
                }
                auVar222 = vdpps_avx(auVar183,auVar242,0x7f);
                auVar89 = vfmadd213ss_fma(ZEXT416((uint)local_8e0._0_4_),auVar96,auVar267._0_16_);
                auVar160 = vdpps_avx(auVar236,auVar242,0x7f);
                auVar277 = vdpps_avx(auVar183,auVar187,0x7f);
                auVar90 = vdpps_avx(local_950,auVar242,0x7f);
                auVar89 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_8e0._0_4_ / fVar86)),auVar89);
                auVar273 = ZEXT1664(auVar89);
                fVar86 = auVar160._0_4_ + auVar277._0_4_;
                auVar97._0_4_ = auVar222._0_4_ * auVar222._0_4_;
                auVar97._4_4_ = auVar222._4_4_ * auVar222._4_4_;
                auVar97._8_4_ = auVar222._8_4_ * auVar222._8_4_;
                auVar97._12_4_ = auVar222._12_4_ * auVar222._12_4_;
                auVar160 = vdpps_avx(auVar183,auVar236,0x7f);
                auVar277 = vsubps_avx(auVar94,auVar97);
                auVar96 = vrsqrtss_avx(auVar277,auVar277);
                fVar154 = auVar277._0_4_;
                fVar158 = auVar96._0_4_;
                fVar158 = fVar158 * 1.5 + fVar154 * -0.5 * fVar158 * fVar158 * fVar158;
                auVar96 = vdpps_avx(auVar183,local_950,0x7f);
                auVar160 = vfnmadd231ss_fma(auVar160,auVar222,ZEXT416((uint)fVar86));
                auVar96 = vfnmadd231ss_fma(auVar96,auVar222,auVar90);
                if (fVar154 < 0.0) {
                  local_a40._0_16_ = auVar222;
                  local_9c0._0_4_ = auVar89._0_4_;
                  local_900._0_16_ = ZEXT416((uint)fVar86);
                  local_a60._0_16_ = auVar90;
                  local_940._0_16_ = auVar160;
                  local_920._0_4_ = fVar158;
                  local_740._0_16_ = auVar96;
                  fVar154 = sqrtf(fVar154);
                  auVar273 = ZEXT464((uint)local_9c0._0_4_);
                  auVar267 = ZEXT464((uint)local_a20._0_4_);
                  fVar158 = (float)local_920._0_4_;
                  auVar96 = local_740._0_16_;
                  auVar222 = local_a40._0_16_;
                  auVar90 = local_a60._0_16_;
                  auVar160 = local_940._0_16_;
                  auVar277 = local_900._0_16_;
                }
                else {
                  auVar277 = vsqrtss_avx(auVar277,auVar277);
                  fVar154 = auVar277._0_4_;
                  auVar277 = ZEXT416((uint)fVar86);
                }
                auVar263 = ZEXT1664(auVar94);
                auVar257 = ZEXT1664(local_a00._0_16_);
                auVar138 = vpermilps_avx(local_720._0_16_,0xff);
                auVar89 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
                auVar120 = vfmsub213ss_fma(auVar160,ZEXT416((uint)fVar158),auVar89);
                auVar290 = ZEXT1664(auVar120);
                auVar188._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
                auVar188._8_4_ = auVar90._8_4_ ^ 0x80000000;
                auVar188._12_4_ = auVar90._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar120._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar120._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar120._12_4_ ^ 0x80000000;
                auVar160 = ZEXT416((uint)(auVar96._0_4_ * fVar158));
                auVar96 = vfmsub231ss_fma(ZEXT416((uint)(auVar90._0_4_ * auVar120._0_4_)),auVar277,
                                          auVar160);
                auVar160 = vinsertps_avx(auVar160,auVar188,0x10);
                uVar81 = auVar96._0_4_;
                auVar189._4_4_ = uVar81;
                auVar189._0_4_ = uVar81;
                auVar189._8_4_ = uVar81;
                auVar189._12_4_ = uVar81;
                auVar160 = vdivps_avx(auVar160,auVar189);
                auVar138 = ZEXT416((uint)(fVar154 - auVar138._0_4_));
                auVar90 = vinsertps_avx(auVar222,auVar138,0x10);
                auVar233 = ZEXT1664(auVar90);
                auVar163._0_4_ = auVar90._0_4_ * auVar160._0_4_;
                auVar163._4_4_ = auVar90._4_4_ * auVar160._4_4_;
                auVar163._8_4_ = auVar90._8_4_ * auVar160._8_4_;
                auVar163._12_4_ = auVar90._12_4_ * auVar160._12_4_;
                auVar160 = vinsertps_avx(auVar205,auVar277,0x1c);
                auVar160 = vdivps_avx(auVar160,auVar189);
                auVar190._0_4_ = auVar90._0_4_ * auVar160._0_4_;
                auVar190._4_4_ = auVar90._4_4_ * auVar160._4_4_;
                auVar190._8_4_ = auVar90._8_4_ * auVar160._8_4_;
                auVar190._12_4_ = auVar90._12_4_ * auVar160._12_4_;
                auVar160 = vhaddps_avx(auVar163,auVar163);
                auVar96 = vhaddps_avx(auVar190,auVar190);
                fVar153 = fVar153 - auVar160._0_4_;
                auVar280 = ZEXT464((uint)fVar153);
                fVar118 = fVar118 - auVar96._0_4_;
                auVar249 = ZEXT464((uint)fVar118);
                auVar222 = vandps_avx(auVar222,local_960);
                if (auVar273._0_4_ <= auVar222._0_4_) {
LAB_0168f3a9:
                  bVar46 = false;
                }
                else {
                  auVar160 = vfmadd231ss_fma(ZEXT416((uint)(auVar267._0_4_ + auVar273._0_4_)),
                                             local_760._0_16_,ZEXT416(0x36000000));
                  auVar222 = vandps_avx(auVar138,local_960);
                  if (auVar160._0_4_ <= auVar222._0_4_) goto LAB_0168f3a9;
                  fVar118 = fVar118 + (float)local_8a0._0_4_;
                  auVar249 = ZEXT464((uint)fVar118);
                  bVar46 = true;
                  if ((((fVar85 <= fVar118) &&
                       (fVar86 = *(float *)(ray + k * 4 + 0x80), fVar118 <= fVar86)) &&
                      (0.0 <= fVar153)) && (fVar153 <= 1.0)) {
                    auVar222 = vrsqrtss_avx(auVar94,auVar94);
                    fVar158 = auVar222._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar76].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar258 = fVar158 * 1.5 + fVar258 * -0.5 * fVar158 * fVar158 * fVar158;
                      local_b20._0_4_ = auVar183._0_4_;
                      local_b20._4_4_ = auVar183._4_4_;
                      fStack_b18 = auVar183._8_4_;
                      fStack_b14 = auVar183._12_4_;
                      auVar139._0_4_ = fVar258 * (float)local_b20._0_4_;
                      auVar139._4_4_ = fVar258 * (float)local_b20._4_4_;
                      auVar139._8_4_ = fVar258 * fStack_b18;
                      auVar139._12_4_ = fVar258 * fStack_b14;
                      auVar96 = vfmadd213ps_fma(auVar89,auVar139,local_a00._0_16_);
                      auVar183 = vshufps_avx(auVar139,auVar139,0xc9);
                      auVar222 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                      auVar140._0_4_ = auVar139._0_4_ * auVar222._0_4_;
                      auVar140._4_4_ = auVar139._4_4_ * auVar222._4_4_;
                      auVar140._8_4_ = auVar139._8_4_ * auVar222._8_4_;
                      auVar140._12_4_ = auVar139._12_4_ * auVar222._12_4_;
                      auVar160 = vfmsub231ps_fma(auVar140,local_a00._0_16_,auVar183);
                      auVar183 = vshufps_avx(auVar160,auVar160,0xc9);
                      auVar222 = vshufps_avx(auVar96,auVar96,0xc9);
                      auVar160 = vshufps_avx(auVar160,auVar160,0xd2);
                      auVar98._0_4_ = auVar96._0_4_ * auVar160._0_4_;
                      auVar98._4_4_ = auVar96._4_4_ * auVar160._4_4_;
                      auVar98._8_4_ = auVar96._8_4_ * auVar160._8_4_;
                      auVar98._12_4_ = auVar96._12_4_ * auVar160._12_4_;
                      auVar183 = vfmsub231ps_fma(auVar98,auVar183,auVar222);
                      uVar81 = auVar183._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar118;
                        uVar3 = vextractps_avx(auVar183,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                        uVar3 = vextractps_avx(auVar183,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar81;
                        *(float *)(ray + k * 4 + 0xf0) = fVar153;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_9c8;
                        *(uint *)(ray + k * 4 + 0x120) = uVar76;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar141._4_4_ = fVar153;
                        auVar141._0_4_ = fVar153;
                        auVar141._8_4_ = fVar153;
                        auVar141._12_4_ = fVar153;
                        local_6e0 = (RTCHitN  [16])vshufps_avx(auVar183,auVar183,0x55);
                        auVar183 = vshufps_avx(auVar183,auVar183,0xaa);
                        auStack_6d0 = auVar183;
                        local_6c0 = uVar81;
                        uStack_6bc = uVar81;
                        uStack_6b8 = uVar81;
                        uStack_6b4 = uVar81;
                        local_6b0 = auVar141;
                        local_6a0 = ZEXT416(0) << 0x20;
                        local_690 = CONCAT44(uStack_6fc,local_700);
                        uStack_688 = CONCAT44(uStack_6f4,uStack_6f8);
                        local_680._4_4_ = uStack_6ec;
                        local_680._0_4_ = local_6f0;
                        local_680._8_4_ = uStack_6e8;
                        local_680._12_4_ = uStack_6e4;
                        vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                        uStack_66c = context->user->instID[0];
                        local_670 = uStack_66c;
                        uStack_668 = uStack_66c;
                        uStack_664 = uStack_66c;
                        uStack_660 = context->user->instPrimID[0];
                        uStack_65c = uStack_660;
                        uStack_658 = uStack_660;
                        uStack_654 = uStack_660;
                        *(float *)(ray + k * 4 + 0x80) = fVar118;
                        local_af0 = *local_9d0;
                        uStack_ae8 = local_9d0[1];
                        local_a90.valid = (int *)&local_af0;
                        local_a90.geometryUserPtr = pGVar4->userPtr;
                        local_a90.context = context->user;
                        local_a90.hit = local_6e0;
                        local_a90.N = 4;
                        local_a90.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar233 = ZEXT1664(auVar90);
                          auVar257 = ZEXT1664(local_a00._0_16_);
                          auVar263 = ZEXT1664(auVar94);
                          auVar267 = ZEXT1664(auVar267._0_16_);
                          auVar273 = ZEXT1664(auVar273._0_16_);
                          auVar290 = ZEXT1664(auVar120);
                          (*pGVar4->intersectionFilterN)(&local_a90);
                          auVar152._8_56_ = extraout_var_02;
                          auVar152._0_8_ = extraout_XMM1_Qa_00;
                          auVar141 = auVar152._0_16_;
                          auVar249 = ZEXT1664(ZEXT416((uint)fVar118));
                          auVar280 = ZEXT1664(ZEXT416((uint)fVar153));
                        }
                        auVar56._8_8_ = uStack_ae8;
                        auVar56._0_8_ = local_af0;
                        if (auVar56 == (undefined1  [16])0x0) {
                          auVar94 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar183 = vpcmpeqd_avx(auVar141,auVar141);
                          auVar94 = auVar94 ^ auVar183;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar183 = vpcmpeqd_avx(auVar183,auVar183);
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar233 = ZEXT1664(auVar233._0_16_);
                            auVar257 = ZEXT1664(auVar257._0_16_);
                            auVar263 = ZEXT1664(auVar263._0_16_);
                            auVar267 = ZEXT1664(auVar267._0_16_);
                            auVar273 = ZEXT1664(auVar273._0_16_);
                            auVar290 = ZEXT1664(auVar290._0_16_);
                            (*p_Var5)(&local_a90);
                            auVar249 = ZEXT1664(ZEXT416((uint)fVar118));
                            auVar280 = ZEXT1664(ZEXT416((uint)fVar153));
                            auVar183 = vpcmpeqd_avx(auVar183,auVar183);
                          }
                          auVar57._8_8_ = uStack_ae8;
                          auVar57._0_8_ = local_af0;
                          auVar222 = vpcmpeqd_avx(auVar57,_DAT_01feba10);
                          auVar94 = auVar222 ^ auVar183;
                          if (auVar57 != (undefined1  [16])0x0) {
                            auVar222 = auVar222 ^ auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])local_a90.hit);
                            *(undefined1 (*) [16])(local_a90.ray + 0xc0) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x10));
                            *(undefined1 (*) [16])(local_a90.ray + 0xd0) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x20));
                            *(undefined1 (*) [16])(local_a90.ray + 0xe0) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x30));
                            *(undefined1 (*) [16])(local_a90.ray + 0xf0) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x40));
                            *(undefined1 (*) [16])(local_a90.ray + 0x100) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x50));
                            *(undefined1 (*) [16])(local_a90.ray + 0x110) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x60));
                            *(undefined1 (*) [16])(local_a90.ray + 0x120) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x70));
                            *(undefined1 (*) [16])(local_a90.ray + 0x130) = auVar183;
                            auVar183 = vmaskmovps_avx(auVar222,*(undefined1 (*) [16])
                                                                (local_a90.hit + 0x80));
                            *(undefined1 (*) [16])(local_a90.ray + 0x140) = auVar183;
                          }
                        }
                        auVar142._8_8_ = 0x100000001;
                        auVar142._0_8_ = 0x100000001;
                        if ((auVar142 & auVar94) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar86;
                        }
                      }
                    }
                  }
                }
                auVar100 = local_5e0;
                bVar84 = lVar83 != 0;
                lVar83 = lVar83 + -1;
              } while ((!bVar46) && (bVar84));
              uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar112._4_4_ = uVar81;
              auVar112._0_4_ = uVar81;
              auVar112._8_4_ = uVar81;
              auVar112._12_4_ = uVar81;
              auVar112._16_4_ = uVar81;
              auVar112._20_4_ = uVar81;
              auVar112._24_4_ = uVar81;
              auVar112._28_4_ = uVar81;
              auVar114 = vcmpps_avx(_local_7c0,auVar112,2);
              local_5e0 = vandps_avx(auVar114,local_5e0);
              auVar100 = auVar100 & auVar114;
              uVar82 = local_600._0_8_;
            } while ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar100 >> 0x7f,0) != '\0') ||
                       (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar100 >> 0xbf,0) != '\0') ||
                     (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar100[0x1f] < '\0');
          }
          auVar150._0_4_ = (float)local_7a0._0_4_ + local_440._0_4_;
          auVar150._4_4_ = (float)local_7a0._4_4_ + local_440._4_4_;
          auVar150._8_4_ = fStack_798 + local_440._8_4_;
          auVar150._12_4_ = fStack_794 + local_440._12_4_;
          auVar150._16_4_ = fStack_790 + local_440._16_4_;
          auVar150._20_4_ = fStack_78c + local_440._20_4_;
          auVar150._24_4_ = fStack_788 + local_440._24_4_;
          auVar150._28_4_ = fStack_784 + local_440._28_4_;
          uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar197._4_4_ = uVar81;
          auVar197._0_4_ = uVar81;
          auVar197._8_4_ = uVar81;
          auVar197._12_4_ = uVar81;
          auVar197._16_4_ = uVar81;
          auVar197._20_4_ = uVar81;
          auVar197._24_4_ = uVar81;
          auVar197._28_4_ = uVar81;
          auVar114 = vcmpps_avx(auVar150,auVar197,2);
          auVar100 = vandps_avx(local_540,local_520);
          auVar100 = vandps_avx(auVar114,auVar100);
          auVar209._0_4_ = (float)local_7a0._0_4_ + local_400._0_4_;
          auVar209._4_4_ = (float)local_7a0._4_4_ + local_400._4_4_;
          auVar209._8_4_ = fStack_798 + local_400._8_4_;
          auVar209._12_4_ = fStack_794 + local_400._12_4_;
          auVar209._16_4_ = fStack_790 + local_400._16_4_;
          auVar209._20_4_ = fStack_78c + local_400._20_4_;
          auVar209._24_4_ = fStack_788 + local_400._24_4_;
          auVar209._28_4_ = fStack_784 + local_400._28_4_;
          auVar103 = vcmpps_avx(auVar209,auVar197,2);
          auVar114 = vandps_avx(local_880,_local_820);
          auVar114 = vandps_avx(auVar103,auVar114);
          auVar114 = vorps_avx(auVar100,auVar114);
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar114 >> 0x7f,0) != '\0') ||
                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0xbf,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar114[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar79 * 0x60) = auVar114;
            auVar100 = vblendvps_avx(_local_400,local_440,auVar100);
            *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x60) = auVar100;
            auVar59._8_8_ = uStack_8a8;
            auVar59._0_8_ = local_8b0;
            uVar1 = vmovlps_avx(auVar59);
            *(undefined8 *)(afStack_140 + uVar79 * 0x18) = uVar1;
            auStack_138[uVar79 * 0x18] = (int)uVar82 + 1;
            uVar79 = (ulong)((int)uVar79 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar79 == 0) {
        uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar99._4_4_ = uVar81;
        auVar99._0_4_ = uVar81;
        auVar99._8_4_ = uVar81;
        auVar99._12_4_ = uVar81;
        auVar94 = vcmpps_avx(local_4b0,auVar99,2);
        uVar76 = vmovmskps_avx(auVar94);
        uVar76 = uVar76 & (uint)local_888 - 1 & (uint)local_888;
        if (uVar76 == 0) {
          return;
        }
        goto LAB_0168d19f;
      }
      uVar80 = (ulong)((int)uVar79 - 1);
      lVar83 = uVar80 * 0x60;
      auVar100 = *(undefined1 (*) [32])(auStack_160 + lVar83);
      auVar113._0_4_ = auVar100._0_4_ + (float)local_7a0._0_4_;
      auVar113._4_4_ = auVar100._4_4_ + (float)local_7a0._4_4_;
      auVar113._8_4_ = auVar100._8_4_ + fStack_798;
      auVar113._12_4_ = auVar100._12_4_ + fStack_794;
      auVar113._16_4_ = auVar100._16_4_ + fStack_790;
      auVar113._20_4_ = auVar100._20_4_ + fStack_78c;
      auVar113._24_4_ = auVar100._24_4_ + fStack_788;
      auVar113._28_4_ = auVar100._28_4_ + fStack_784;
      uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar198._4_4_ = uVar81;
      auVar198._0_4_ = uVar81;
      auVar198._8_4_ = uVar81;
      auVar198._12_4_ = uVar81;
      auVar198._16_4_ = uVar81;
      auVar198._20_4_ = uVar81;
      auVar198._24_4_ = uVar81;
      auVar198._28_4_ = uVar81;
      auVar103 = vcmpps_avx(auVar113,auVar198,2);
      auVar114 = vandps_avx(auVar103,*(undefined1 (*) [32])(auStack_180 + lVar83));
      _local_6e0 = auVar114;
      auVar103 = *(undefined1 (*) [32])(auStack_180 + lVar83) & auVar103;
      bVar52 = (auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar53 = (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar51 = (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar50 = SUB321(auVar103 >> 0x7f,0) == '\0';
      bVar49 = (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar48 = SUB321(auVar103 >> 0xbf,0) == '\0';
      bVar84 = (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar46 = -1 < auVar103[0x1f];
      if (((((((!bVar52 || !bVar53) || !bVar51) || !bVar50) || !bVar49) || !bVar48) || !bVar84) ||
          !bVar46) {
        auVar170._8_4_ = 0x7f800000;
        auVar170._0_8_ = 0x7f8000007f800000;
        auVar170._12_4_ = 0x7f800000;
        auVar170._16_4_ = 0x7f800000;
        auVar170._20_4_ = 0x7f800000;
        auVar170._24_4_ = 0x7f800000;
        auVar170._28_4_ = 0x7f800000;
        auVar100 = vblendvps_avx(auVar170,auVar100,auVar114);
        auVar103 = vshufps_avx(auVar100,auVar100,0xb1);
        auVar103 = vminps_avx(auVar100,auVar103);
        auVar9 = vshufpd_avx(auVar103,auVar103,5);
        auVar103 = vminps_avx(auVar103,auVar9);
        auVar9 = vpermpd_avx2(auVar103,0x4e);
        auVar103 = vminps_avx(auVar103,auVar9);
        auVar100 = vcmpps_avx(auVar100,auVar103,0);
        auVar103 = auVar114 & auVar100;
        if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar103 >> 0x7f,0) != '\0') ||
              (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar103 >> 0xbf,0) != '\0') ||
            (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar103[0x1f] < '\0') {
          auVar114 = vandps_avx(auVar100,auVar114);
        }
        fVar118 = afStack_140[uVar80 * 0x18 + 1];
        uVar82 = (ulong)auStack_138[uVar80 * 0x18];
        uVar77 = vmovmskps_avx(auVar114);
        iVar12 = 0;
        for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
          iVar12 = iVar12 + 1;
        }
        fVar86 = afStack_140[uVar80 * 0x18];
        auVar115._4_4_ = fVar86;
        auVar115._0_4_ = fVar86;
        auVar115._8_4_ = fVar86;
        auVar115._12_4_ = fVar86;
        auVar115._16_4_ = fVar86;
        auVar115._20_4_ = fVar86;
        auVar115._24_4_ = fVar86;
        auVar115._28_4_ = fVar86;
        *(undefined4 *)(local_6e0 + (uint)(iVar12 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar83) = _local_6e0;
        if ((((((((_local_6e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_6e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_6e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_6e0 >> 0x7f,0) != '\0') ||
              (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_6e0 >> 0xbf,0) != '\0') ||
            (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_6e0[0x1f] < '\0') {
          uVar80 = uVar79;
        }
        fVar118 = fVar118 - fVar86;
        auVar151._4_4_ = fVar118;
        auVar151._0_4_ = fVar118;
        auVar151._8_4_ = fVar118;
        auVar151._12_4_ = fVar118;
        auVar151._16_4_ = fVar118;
        auVar151._20_4_ = fVar118;
        auVar151._24_4_ = fVar118;
        auVar151._28_4_ = fVar118;
        auVar94 = vfmadd132ps_fma(auVar151,auVar115,_DAT_02020f20);
        local_440 = ZEXT1632(auVar94);
        local_8b0 = *(undefined8 *)(local_440 + (uint)(iVar12 << 2));
        uStack_8a8 = 0;
      }
      uVar79 = uVar80;
    } while (((((((bVar52 && bVar53) && bVar51) && bVar50) && bVar49) && bVar48) && bVar84) &&
             bVar46);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }